

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_with_concurrent_updates_test(void)

{
  list_elem **pplVar1;
  uint64_t *__s;
  fdb_seqnum_t *__s_00;
  bottom_up_build_ctx *__s_01;
  fdb_commit_opt_t opt;
  fdb_iterator *pfVar2;
  avl_node *__n;
  fdb_doc *doc;
  size_t *psVar3;
  size_t keylen;
  fdb_config *pfVar4;
  long lVar5;
  undefined8 doc_00;
  undefined1 *puVar6;
  fdb_status fVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  __atomic_base<unsigned_long> _Var11;
  __atomic_base<unsigned_long> _Var12;
  size_t sVar13;
  uint uVar14;
  fdb_file_handle *pfVar15;
  long lVar16;
  __atomic_base<unsigned_long> _Var17;
  fdb_kvs_handle *pfVar18;
  __atomic_base<unsigned_long> _Var19;
  __atomic_base<unsigned_long> _Var20;
  char *fconfig;
  atomic<unsigned_char> *fconfig_00;
  fdb_doc *pfVar21;
  list *doc_01;
  fdb_kvs_handle *pfVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  undefined1 *puVar41;
  undefined1 *puVar42;
  undefined1 *puVar43;
  undefined1 *puVar44;
  undefined1 *puVar45;
  undefined1 *puVar46;
  undefined1 *puVar47;
  fdb_kvs_handle *pfVar48;
  fdb_doc *unaff_RBP;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar49;
  char *pcVar50;
  char *pcVar51;
  filemgr *pfVar52;
  hbtrie *doc_02;
  fdb_doc *unaff_R12;
  btreeblk_handle *pbVar53;
  btreeblk_handle *pbVar54;
  char *doc_03;
  long unaff_R13;
  ulong uVar55;
  char *pcVar56;
  filemgr *pfVar57;
  ulong uVar58;
  void *pvVar59;
  btree *pbVar60;
  bool bVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  fdb_iterator *itr;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db3;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db1;
  timeval __test_begin;
  char bodybuf [256];
  char keybuf [256];
  uint8_t auStackY_122f9 [1805];
  fdb_commit_opt_t afStackY_11bec [4132];
  fdb_kvs_handle afStack_10bb8 [125];
  undefined8 uStack_c50;
  undefined1 auStack_c38 [8];
  fdb_config fStack_c30;
  btreeblk_handle abStack_b38 [2];
  int64_t aiStack_a38 [32];
  list_elem *aplStack_938 [33];
  timeval tStack_830;
  undefined1 auStack_820 [32];
  btreeblk_handle *apbStack_800 [7];
  btreeblk_handle *pbStack_7c8;
  btreeblk_handle *pbStack_7c0;
  __atomic_base<unsigned_long> _Stack_7b8;
  undefined1 auStack_7b0 [8];
  undefined1 auStack_7a8 [16];
  __atomic_base<unsigned_long> _Stack_798;
  atomic<unsigned_long> aStack_790;
  atomic<unsigned_long> aStack_788;
  atomic<unsigned_long> aStack_778;
  char *pcStack_770;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_768;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_760;
  filemgr *pfStack_758;
  __atomic_base<unsigned_long> _Stack_750;
  timeval tStack_748;
  fdb_kvs_config fStack_738;
  char acStack_720 [256];
  char acStack_620 [256];
  fdb_config fStack_520;
  fdb_file_handle *pfStack_428;
  fdb_doc *pfStack_420;
  long lStack_418;
  fdb_kvs_handle *pfStack_410;
  btree *pbStack_408;
  fdb_doc *pfStack_400;
  fdb_iterator *local_3e8;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [40];
  fdb_doc local_388;
  fdb_config local_330;
  fdb_doc local_238 [3];
  
  pfStack_400 = (fdb_doc *)0x111caa;
  gettimeofday((timeval *)(local_3b0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_400 = (fdb_doc *)0x111caf;
  memleak_start();
  local_3e0._0_8_ = (fdb_kvs_handle *)0x0;
  pfStack_400 = (fdb_doc *)0x111cc4;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_400 = (fdb_doc *)0x111cd4;
  fdb_get_default_config();
  local_330.seqtree_opt = '\x01';
  pfVar18 = (fdb_kvs_handle *)local_3b0;
  pfStack_400 = (fdb_doc *)0x111ce5;
  fdb_get_default_kvs_config();
  pbVar60 = (btree *)(local_3e0 + 8);
  pfStack_400 = (fdb_doc *)0x111cfc;
  fdb_open((fdb_file_handle **)pbVar60,"./iterator_test1",&local_330);
  pfVar15 = (fdb_file_handle *)local_3c0;
  pfStack_400 = (fdb_doc *)0x111d0f;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_3e0._8_8_,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)pfVar18
            );
  pfStack_400 = (fdb_doc *)0x111d25;
  fVar7 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_3c0._0_8_,logCallbackFunc,
                     "iterator_concurrent_update_test");
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011200a;
  pfVar15 = (fdb_file_handle *)(local_3d0 + 8);
  pfStack_400 = (fdb_doc *)0x111d44;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_3e0._8_8_,(fdb_kvs_handle **)pfVar15,
             (fdb_kvs_config *)local_3b0);
  pfStack_400 = (fdb_doc *)0x111d5a;
  fVar7 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_3d0._8_8_,logCallbackFunc,
                     "iterator_concurrent_update_test");
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011200f;
  pfVar15 = (fdb_file_handle *)local_3d0;
  pfStack_400 = (fdb_doc *)0x111d79;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_3e0._8_8_,(fdb_kvs_handle **)pfVar15,
             (fdb_kvs_config *)local_3b0);
  pfStack_400 = (fdb_doc *)0x111d8f;
  fVar7 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_3d0._0_8_,logCallbackFunc,
                     "iterator_concurrent_update_test");
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00112014;
  unaff_R12 = local_238;
  pbVar60 = (btree *)0x0;
  uVar55 = 0;
  do {
    pfStack_400 = (fdb_doc *)0x111dc1;
    sprintf((char *)&stack0xfffffffffffffec8,"key%d",uVar55 & 0xffffffff);
    pfStack_400 = (fdb_doc *)0x111dd5;
    sprintf((char *)unaff_R12,"body%d",uVar55 & 0xffffffff);
    unaff_RBP = (fdb_doc *)((long)&local_388 + (long)pbVar60);
    pfStack_400 = (fdb_doc *)0x111de5;
    sVar9 = strlen((char *)&stack0xfffffffffffffec8);
    pfStack_400 = (fdb_doc *)0x111df0;
    sVar10 = strlen((char *)unaff_R12);
    pfStack_400 = (fdb_doc *)0x111e0a;
    fdb_doc_create((fdb_doc **)unaff_RBP,(fdb_kvs_handle *)&stack0xfffffffffffffec8,sVar9,
                   (void *)0x0,0,unaff_R12,sVar10);
    pfStack_400 = (fdb_doc *)0x111e19;
    fdb_set((fdb_kvs_handle *)local_3c0._0_8_,*(fdb_doc **)((long)&local_388 + uVar55 * 8));
    uVar55 = uVar55 + 1;
    pbVar60 = (btree *)((long)pbVar60 + 8);
  } while (uVar55 != 10);
  pfStack_400 = (fdb_doc *)0x111e35;
  fdb_commit((fdb_file_handle *)local_3e0._8_8_,'\x01');
  unaff_R13 = 0;
  pfStack_400 = (fdb_doc *)0x111e58;
  fdb_iterator_init((fdb_kvs_handle *)local_3d0._8_8_,&local_3e8,(void *)0x0,0,(void *)0x0,0,0);
  pfVar15 = (fdb_file_handle *)local_3e0;
  pfVar18 = (fdb_kvs_handle *)&stack0xfffffffffffffec8;
  do {
    pfStack_400 = (fdb_doc *)0x111e6a;
    fVar7 = fdb_iterator_get(local_3e8,(fdb_doc **)pfVar15);
    doc_00 = local_3e0._0_8_;
    if (fVar7 != FDB_RESULT_SUCCESS) {
      pfStack_400 = (fdb_doc *)0x111fef;
      iterator_with_concurrent_updates_test();
LAB_00111fef:
      pfStack_400 = (fdb_doc *)0x111ffa;
      iterator_with_concurrent_updates_test();
LAB_00111ffa:
      pfStack_400 = (fdb_doc *)0x112005;
      iterator_with_concurrent_updates_test();
      goto LAB_00112005;
    }
    pbVar60 = *(btree **)(local_3e0._0_8_ + 0x20);
    unaff_RBP = *(fdb_doc **)((long)&local_388 + unaff_R13 * 8);
    unaff_R12 = (fdb_doc *)unaff_RBP->key;
    pfStack_400 = (fdb_doc *)0x111e92;
    iVar8 = bcmp(pbVar60,unaff_R12,*(size_t *)(fdb_kvs_config *)local_3e0._0_8_);
    pfVar18 = (fdb_kvs_handle *)doc_00;
    if (iVar8 != 0) goto LAB_00111fef;
    pbVar60 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(doc_00 + 0x40))->seqtree;
    unaff_R12 = (fdb_doc *)unaff_RBP->body;
    pfStack_400 = (fdb_doc *)0x111eb1;
    iVar8 = bcmp(pbVar60,unaff_R12,(size_t)((fdb_kvs_config *)doc_00)->custom_cmp_param);
    if (iVar8 != 0) goto LAB_00111ffa;
    unaff_R13 = unaff_R13 + 1;
    pfStack_400 = (fdb_doc *)0x111ec4;
    fdb_doc_free((fdb_doc *)doc_00);
    local_3e0._0_8_ = (fdb_kvs_handle *)0x0;
    pfStack_400 = (fdb_doc *)0x111ed7;
    fVar7 = fdb_iterator_next(local_3e8);
  } while (fVar7 == FDB_RESULT_SUCCESS);
  pfStack_400 = (fdb_doc *)0x111ee5;
  fdb_iterator_close(local_3e8);
  if (unaff_R13 != 10) goto LAB_00112019;
  pfStack_400 = (fdb_doc *)0x111f05;
  fdb_iterator_sequence_init((fdb_kvs_handle *)local_3d0._0_8_,&local_3e8,0,0,0);
  pfVar15 = (fdb_file_handle *)0x1;
  pfVar18 = (fdb_kvs_handle *)local_3e0;
  pbVar60 = (btree *)(local_3c0 + 8);
  do {
    pfStack_400 = (fdb_doc *)0x111f21;
    fVar7 = fdb_iterator_get(local_3e8,(fdb_doc **)pfVar18);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00112005;
    pfVar48 = (fdb_kvs_handle *)local_3e0._0_8_;
    if (pfVar15 != *(fdb_file_handle **)(local_3e0._0_8_ + 0x28)) {
      pfStack_400 = (fdb_doc *)0x111f63;
      iterator_with_concurrent_updates_test();
      pfVar48 = (fdb_kvs_handle *)local_3c0._8_8_;
    }
    pfStack_400 = (fdb_doc *)0x111f39;
    fdb_doc_free((fdb_doc *)pfVar48);
    local_3e0._0_8_ = (fdb_kvs_handle *)0x0;
    pfStack_400 = (fdb_doc *)0x111f4c;
    fVar7 = fdb_iterator_next(local_3e8);
    pfVar15 = (fdb_file_handle *)((long)&pfVar15->root + 1);
  } while (fVar7 == FDB_RESULT_SUCCESS);
  pfStack_400 = (fdb_doc *)0x111f74;
  fdb_iterator_close(local_3e8);
  if (pfVar15 == (fdb_file_handle *)0xb) {
    pfStack_400 = (fdb_doc *)0x111f88;
    fdb_close((fdb_file_handle *)local_3e0._8_8_);
    lVar16 = 0;
    do {
      pfStack_400 = (fdb_doc *)0x111f94;
      fdb_doc_free(*(fdb_doc **)((long)&local_388 + lVar16 * 8));
      lVar16 = lVar16 + 1;
    } while (lVar16 != 10);
    pfStack_400 = (fdb_doc *)0x111fa2;
    fdb_shutdown();
    pfStack_400 = (fdb_doc *)0x111fa7;
    memleak_end();
    pcVar51 = "%s PASSED\n";
    if (iterator_with_concurrent_updates_test()::__test_pass != '\0') {
      pcVar51 = "%s FAILED\n";
    }
    pfStack_400 = (fdb_doc *)0x111fd8;
    fprintf(_stderr,pcVar51,"iterator with concurrent updates test");
    return;
  }
  goto LAB_0011201e;
LAB_0011312d:
  iterator_seek_test();
  pfVar18 = (fdb_kvs_handle *)_Var17._M_i;
  _Var19._M_i = _Var11._M_i;
LAB_00113138:
  _Var11._M_i = _Var19._M_i;
  iterator_seek_test();
LAB_0011313d:
  iterator_seek_test();
LAB_00113148:
  iterator_seek_test();
LAB_00113153:
  iterator_seek_test();
  _Var17._M_i = _Var11._M_i;
LAB_0011315e:
  _Var11._M_i = _Var17._M_i;
  iterator_seek_test();
LAB_00113163:
  iterator_seek_test();
LAB_0011316e:
  iterator_seek_test();
LAB_00113179:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11317e;
  iterator_seek_test();
  pfVar22 = (fdb_kvs_handle *)_Var20._M_i;
  goto LAB_0011317e;
LAB_00115083:
  fconfig = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
  pcVar50 = (char *)(ulong)uVar14;
  pcVar51 = "key%06d";
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115093;
  iterator_complete_test();
LAB_00115093:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150a3;
  iterator_complete_test();
LAB_001150a3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150b3;
  iterator_complete_test();
LAB_001150b3:
  doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150c3;
  iterator_complete_test();
LAB_001150c3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150d3;
  iterator_complete_test();
LAB_001150d3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150e3;
  iterator_complete_test();
LAB_001150e3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150f3;
  iterator_complete_test();
LAB_001150f3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150f8;
  iterator_complete_test();
LAB_001150f8:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150fd;
  iterator_complete_test();
LAB_001150fd:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115102;
  iterator_complete_test();
LAB_00115102:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115107;
  iterator_complete_test();
LAB_00115107:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11510c;
  iterator_complete_test();
LAB_0011510c:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115111;
  iterator_complete_test();
LAB_00115111:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115116;
  iterator_complete_test();
LAB_00115116:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11511b;
  iterator_complete_test();
LAB_0011511b:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115120;
  iterator_complete_test();
LAB_00115120:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115125;
  iterator_complete_test();
LAB_00115125:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11512a;
  iterator_complete_test();
LAB_0011512a:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11512f;
  iterator_complete_test();
LAB_0011512f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11513f;
  iterator_complete_test();
LAB_0011513f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11514f;
  iterator_complete_test();
LAB_0011514f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11515f;
  iterator_complete_test();
LAB_0011515f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11516f;
  iterator_complete_test();
  pfVar52 = (filemgr *)pcVar56;
LAB_0011516f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115174;
  iterator_complete_test();
LAB_00115174:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115179;
  iterator_complete_test();
  pfVar57 = pfVar52;
LAB_00115179:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11517e;
  iterator_complete_test();
  pfVar52 = pfVar57;
LAB_0011517e:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115183;
  iterator_complete_test();
LAB_00115183:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115188;
  iterator_complete_test();
  pfVar48 = pfVar18;
LAB_00115188:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11518d;
  iterator_complete_test();
LAB_0011518d:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115192;
  iterator_complete_test();
LAB_00115192:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115197;
  iterator_complete_test();
  pcVar56 = (char *)pfVar52;
  pfVar18 = pfVar48;
LAB_00115197:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11519c;
  iterator_complete_test();
LAB_0011519c:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151a1;
  iterator_complete_test();
  goto LAB_001151a1;
LAB_00115708:
  (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115715;
  iterator_extreme_key_test();
LAB_00115715:
  (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115722;
  iterator_extreme_key_test();
LAB_00115722:
  pfVar18 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
  pcVar51 = "0xff length %d";
  doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask;
  (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11572f;
  pfVar48 = (fdb_kvs_handle *)doc_03;
  iterator_extreme_key_test();
  goto LAB_0011572f;
LAB_00112005:
  pfStack_400 = (fdb_doc *)0x11200a;
  iterator_with_concurrent_updates_test();
LAB_0011200a:
  pfStack_400 = (fdb_doc *)0x11200f;
  iterator_with_concurrent_updates_test();
LAB_0011200f:
  pfStack_400 = (fdb_doc *)0x112014;
  iterator_with_concurrent_updates_test();
LAB_00112014:
  pfStack_400 = (fdb_doc *)0x112019;
  iterator_with_concurrent_updates_test();
LAB_00112019:
  pfStack_400 = (fdb_doc *)0x11201e;
  iterator_with_concurrent_updates_test();
LAB_0011201e:
  pfStack_400 = (fdb_doc *)iterator_compact_uncommitted_db;
  iterator_with_concurrent_updates_test();
  aStack_768.seqtree = (btree *)0x112040;
  pfStack_428 = pfVar15;
  pfStack_420 = unaff_R12;
  lStack_418 = unaff_R13;
  pfStack_410 = pfVar18;
  pbStack_408 = pbVar60;
  pfStack_400 = unaff_RBP;
  gettimeofday(&tStack_748,(__timezone_ptr_t)0x0);
  aStack_768.seqtree = (btree *)0x112045;
  memleak_start();
  aStack_768.seqtree = (btree *)0x112055;
  fdb_get_default_config();
  aStack_768.seqtree = (btree *)0x112062;
  fdb_get_default_kvs_config();
  fStack_520.wal_threshold = 0x400;
  fStack_520.seqtree_opt = '\x01';
  fStack_520.flags = 1;
  aStack_768.seqtree = (btree *)0x112081;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_768.seqtree = (btree *)0x112098;
  fdb_open((fdb_file_handle **)&_Stack_750,"./iterator_test1",&fStack_520);
  aStack_768.seqtree = (btree *)0x1120af;
  fdb_kvs_open((fdb_file_handle *)_Stack_750._M_i,(fdb_kvs_handle **)&pfStack_758,"db1",&fStack_738)
  ;
  pcVar51 = acStack_720 + 0x100;
  aVar49.seqtree = (btree *)0x0;
  do {
    aStack_768.seqtree = (btree *)0x1120d8;
    sprintf(pcVar51,"key%d",aVar49.seqtree);
    aStack_768.seqtree = (btree *)0x1120e7;
    sprintf(acStack_720,"body%d",aVar49.seqtree);
    pcVar56 = (char *)pfStack_758;
    aStack_768.seqtree = (btree *)0x1120f4;
    _Var11._M_i = strlen(pcVar51);
    aStack_768.seqtree = (btree *)0x1120ff;
    sVar9 = strlen(acStack_720);
    aStack_768.seqtree = (btree *)0x112113;
    fdb_set_kv((fdb_kvs_handle *)pcVar56,pcVar51,_Var11._M_i,acStack_720,sVar9);
    aVar49._0_4_ = aVar49._0_4_ + 1;
    aVar49._4_4_ = 0;
  } while (aVar49._0_4_ != 10);
  aStack_768.seqtree = (btree *)0x11212e;
  fVar7 = fdb_iterator_sequence_init
                    ((fdb_kvs_handle *)pfStack_758,(fdb_iterator **)&aStack_760.seqtree,0,0,0);
  if (fVar7 == FDB_RESULT_SUCCESS) {
    _Var11._M_i = 10;
    do {
      aStack_768.seqtree = (btree *)0x112144;
      fVar7 = fdb_iterator_next((fdb_iterator *)aStack_760.seqtree);
      uVar14 = (int)_Var11._M_i - 1;
      _Var11._M_i = (__int_type)uVar14;
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    aStack_768.seqtree = (btree *)0x112154;
    fdb_iterator_close((fdb_iterator *)aStack_760.seqtree);
    if (uVar14 != 0) goto LAB_00112277;
    aStack_768.seqtree = (btree *)0x112168;
    fdb_compact((fdb_file_handle *)_Stack_750._M_i,(char *)0x0);
    pcVar51 = acStack_720 + 0x100;
    aVar49.seqtree = (btree *)0x0;
    do {
      aStack_768.seqtree = (btree *)0x112191;
      sprintf(pcVar51,"key%d",aVar49.seqtree);
      aStack_768.seqtree = (btree *)0x1121a0;
      sprintf(acStack_720,"body%d",aVar49.seqtree);
      pcVar56 = (char *)pfStack_758;
      aStack_768.seqtree = (btree *)0x1121ad;
      _Var11._M_i = strlen(pcVar51);
      aStack_768.seqtree = (btree *)0x1121b8;
      sVar9 = strlen(acStack_720);
      aStack_768.seqtree = (btree *)0x1121cc;
      fdb_set_kv((fdb_kvs_handle *)pcVar56,pcVar51,_Var11._M_i,acStack_720,sVar9);
      aVar49._0_4_ = aVar49._0_4_ + 1;
      aVar49._4_4_ = 0;
    } while (aVar49._0_4_ != 10);
    aStack_768.seqtree = (btree *)0x1121e7;
    fVar7 = fdb_iterator_sequence_init
                      ((fdb_kvs_handle *)pfStack_758,(fdb_iterator **)&aStack_760.seqtree,0,0,0);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011227c;
    _Var11._M_i = 10;
    do {
      aStack_768.seqtree = (btree *)0x1121fd;
      fVar7 = fdb_iterator_next((fdb_iterator *)aStack_760.seqtree);
      uVar14 = (int)_Var11._M_i - 1;
      _Var11._M_i = (__int_type)uVar14;
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    aStack_768.seqtree = (btree *)0x11220d;
    fdb_iterator_close((fdb_iterator *)aStack_760.seqtree);
    if (uVar14 == 0) {
      aStack_768.seqtree = (btree *)0x11221b;
      fdb_kvs_close((fdb_kvs_handle *)pfStack_758);
      aStack_768.seqtree = (btree *)0x112225;
      fdb_close((fdb_file_handle *)_Stack_750._M_i);
      aStack_768.seqtree = (btree *)0x11222a;
      fdb_shutdown();
      aStack_768.seqtree = (btree *)0x11222f;
      memleak_end();
      pcVar51 = "%s PASSED\n";
      if (iterator_compact_uncommitted_db()::__test_pass != '\0') {
        pcVar51 = "%s FAILED\n";
      }
      aStack_768.seqtree = (btree *)0x112260;
      fprintf(_stderr,pcVar51,"iterator compact uncommitted db");
      return;
    }
  }
  else {
    aStack_768.seqtree = (btree *)0x112277;
    iterator_compact_uncommitted_db();
LAB_00112277:
    aStack_768.seqtree = (btree *)0x11227c;
    iterator_compact_uncommitted_db();
LAB_0011227c:
    aStack_768.seqtree = (btree *)0x112281;
    iterator_compact_uncommitted_db();
  }
  _Var12._M_i = (__int_type)acStack_720;
  aStack_768.seqtree = (btree *)iterator_seek_test;
  iterator_compact_uncommitted_db();
  pcVar50 = (char *)&aStack_768;
  pcStack_770 = "body%d";
  puVar23 = auStack_c38;
  puVar24 = auStack_c38;
  puVar25 = auStack_c38;
  puVar26 = auStack_c38;
  puVar27 = auStack_c38;
  puVar28 = auStack_c38;
  puVar29 = auStack_c38;
  puVar30 = auStack_c38;
  puVar31 = auStack_c38;
  puVar32 = auStack_c38;
  puVar33 = auStack_c38;
  puVar34 = auStack_c38;
  puVar35 = auStack_c38;
  puVar36 = auStack_c38;
  puVar37 = auStack_c38;
  puVar38 = auStack_c38;
  puVar39 = auStack_c38;
  puVar40 = auStack_c38;
  puVar41 = auStack_c38;
  puVar42 = auStack_c38;
  puVar43 = auStack_c38;
  puVar44 = auStack_c38;
  puVar45 = auStack_c38;
  puVar46 = auStack_c38;
  puVar47 = auStack_c38;
  pfVar48 = (fdb_kvs_handle *)auStack_c38;
  _Var20._M_i = (__int_type)auStack_c38;
  aStack_790.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var11._M_i;
  aStack_788.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var12._M_i;
  aStack_778.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)((long)acStack_720 + 0x100);
  aStack_768 = aVar49;
  gettimeofday((timeval *)(aplStack_938 + 0x21),(__timezone_ptr_t)0x0);
  memleak_start();
  _Stack_798._M_i = 0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  _Var11._M_i = (__int_type)auStack_820;
  fdb_get_default_kvs_config();
  fStack_c30.buffercache_size = 0;
  fStack_c30.wal_threshold = 0x400;
  fStack_c30.flags = 1;
  fStack_c30.compaction_threshold = '\0';
  fStack_c30.purging_interval = 1;
  pcVar51 = auStack_7b0;
  fdb_open((fdb_file_handle **)pcVar51,"./iterator_test1",&fStack_c30);
  pfVar18 = (fdb_kvs_handle *)auStack_7a8;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_7b0,(fdb_kvs_handle **)pfVar18,(fdb_kvs_config *)_Var11._M_i
            );
  fVar7 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_7a8._0_8_,logCallbackFunc,"iterator_seek_test");
  pfVar22 = (fdb_kvs_handle *)auStack_c38;
  if (fVar7 == FDB_RESULT_SUCCESS) {
    fVar7 = fdb_kvs_open((fdb_file_handle *)auStack_7b0,(fdb_kvs_handle **)&_Stack_7b8,"kv1",
                         (fdb_kvs_config *)auStack_820);
    puVar6 = auStack_c38;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113183;
    _Var17._M_i = 0;
    pcVar51 = (char *)0x0;
    do {
      pplVar1 = &abStack_b38[4].alc_list.tail;
      sprintf((char *)pplVar1,"kEy%d",(ulong)pcVar51 & 0xffffffff);
      sprintf((char *)abStack_b38,"mEta%d",(ulong)pcVar51 & 0xffffffff);
      sprintf((char *)&abStack_b38[2].ndeltanodes,"bOdy%d",(ulong)pcVar51 & 0xffffffff);
      pcVar56 = (char *)((long)&((fdb_kvs_handle *)_Var17._M_i)->kvs + (long)auStack_820);
      _Var11._M_i = strlen((char *)pplVar1);
      _Var12._M_i = strlen((char *)abStack_b38);
      sVar9 = strlen((char *)&abStack_b38[2].ndeltanodes);
      uStack_c50 = 0x11240a;
      fdb_doc_create((fdb_doc **)pcVar56,&abStack_b38[4].alc_list.tail,_Var11._M_i,abStack_b38,
                     _Var12._M_i,&abStack_b38[2].ndeltanodes,sVar9);
      fVar7 = fdb_set((fdb_kvs_handle *)_Stack_7b8._M_i,
                      (fdb_doc *)
                      apbStack_800[(long)&((filemgr *)((long)pcVar51 + -0x2f0))->field_0x2ef]);
      if (fVar7 != FDB_RESULT_SUCCESS) {
        iterator_seek_test();
        goto LAB_0011312d;
      }
      fdb_doc_free((fdb_doc *)
                   apbStack_800[(long)&((filemgr *)((long)pcVar51 + -0x2f0))->field_0x2ef]);
      pcVar51 = &((fdb_kvs_config *)&((filemgr *)pcVar51)->filename)->field_0x1;
      _Var17._M_i = (__int_type)&(((fdb_kvs_handle *)_Var17._M_i)->kvs_config).custom_cmp;
    } while (pcVar51 != (undefined1 *)0xa);
    lVar16 = 8;
    uVar55 = 1;
    do {
      pplVar1 = &abStack_b38[4].alc_list.tail;
      sprintf((char *)pplVar1,"key%d",uVar55 & 0xffffffff);
      sprintf((char *)abStack_b38,"meta%d",uVar55 & 0xffffffff);
      sprintf((char *)&abStack_b38[2].ndeltanodes,"body%d",uVar55 & 0xffffffff);
      sVar9 = strlen((char *)pplVar1);
      sVar10 = strlen((char *)abStack_b38);
      sVar13 = strlen((char *)&abStack_b38[2].ndeltanodes);
      uStack_c50 = 0x1124f4;
      fdb_doc_create((fdb_doc **)(auStack_820 + lVar16 + 0x18),&abStack_b38[4].alc_list.tail,sVar9,
                     abStack_b38,sVar10,&abStack_b38[2].ndeltanodes,sVar13);
      fdb_set((fdb_kvs_handle *)auStack_7a8._0_8_,(fdb_doc *)apbStack_800[uVar55 - 1]);
      lVar16 = lVar16 + 0x10;
      bVar61 = uVar55 < 8;
      uVar55 = uVar55 + 2;
    } while (bVar61);
    fdb_commit((fdb_file_handle *)auStack_7b0,'\x01');
    lVar16 = 0;
    uVar55 = 0;
    do {
      pplVar1 = &abStack_b38[4].alc_list.tail;
      sprintf((char *)pplVar1,"key%d",uVar55 & 0xffffffff);
      sprintf((char *)abStack_b38,"meta%d",uVar55 & 0xffffffff);
      sprintf((char *)&abStack_b38[2].ndeltanodes,"body%d",uVar55 & 0xffffffff);
      pcVar56 = auStack_820 + lVar16 + 0x18;
      _Var11._M_i = strlen((char *)pplVar1);
      _Var12._M_i = strlen((char *)abStack_b38);
      sVar9 = strlen((char *)&abStack_b38[2].ndeltanodes);
      uStack_c50 = 0x1125d4;
      fdb_doc_create((fdb_doc **)pcVar56,&abStack_b38[4].alc_list.tail,_Var11._M_i,abStack_b38,
                     _Var12._M_i,&abStack_b38[2].ndeltanodes,sVar9);
      fdb_set((fdb_kvs_handle *)auStack_7a8._0_8_,(fdb_doc *)apbStack_800[uVar55 - 1]);
      pcVar51 = (char *)(uVar55 + 2);
      lVar16 = lVar16 + 0x10;
      bVar61 = uVar55 < 8;
      uVar55 = (ulong)pcVar51;
    } while (bVar61);
    fdb_commit((fdb_file_handle *)auStack_7b0,'\0');
    uStack_c50 = 0x112629;
    fdb_iterator_init((fdb_kvs_handle *)auStack_7a8._0_8_,(fdb_iterator **)(auStack_7a8 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var17._M_i = _Stack_798._M_i;
    pbVar53 = (btreeblk_handle *)auStack_820._24_8_;
    pfVar18 = (fdb_kvs_handle *)(auStack_7a8 + 8);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113188;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)((list *)(auStack_820._24_8_ + 0x18))->tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_0011318d;
    _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
    pcVar51 = *(char **)((long)pbVar53 + 0x38);
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
    if (iVar8 != 0) goto LAB_00113198;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
    pcVar51 = *(char **)((long)pbVar53 + 0x40);
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var17._M_i + 0x10));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_001131a3;
    fdb_doc_free((fdb_doc *)_Var17._M_i);
    _Var17._M_i = auStack_7a8._8_8_;
    _Stack_798._M_i = 0;
    _Var11._M_i = (__int_type)(apbStack_800[1]->alc_list).tail;
    sVar9 = strlen((char *)&abStack_b38[4].alc_list.tail);
    fVar7 = fdb_iterator_seek((fdb_iterator *)_Var17._M_i,(void *)_Var11._M_i,sVar9,'\0');
    if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001131ae;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var12._M_i = _Stack_798._M_i;
    pbVar54 = apbStack_800[1];
    puVar6 = auStack_c38;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001131b3;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)(apbStack_800[1]->alc_list).tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    if (iVar8 != 0) goto LAB_001131b8;
    _Var11._M_i = *(__int_type *)(_Var12._M_i + 0x38);
    pcVar51 = (char *)pbVar54->file;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var12._M_i + 8));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_001131c3;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var12._M_i + 0x40))->seqtree;
    pcVar51 = (char *)pbVar54->log_callback;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var12._M_i + 0x10));
    if (iVar8 != 0) goto LAB_001131ce;
    fdb_doc_free((fdb_doc *)_Var12._M_i);
    _Stack_798._M_i = 0;
    fVar7 = fdb_iterator_next((fdb_iterator *)auStack_7a8._8_8_);
    puVar6 = auStack_c38;
    if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001131d9;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var17._M_i = _Stack_798._M_i;
    pbVar53 = apbStack_800[2];
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001131de;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)(apbStack_800[2]->alc_list).tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_001131e3;
    _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
    pcVar51 = (char *)pbVar53->file;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
    if (iVar8 != 0) goto LAB_001131ee;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
    pcVar51 = (char *)pbVar53->log_callback;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var17._M_i + 0x10));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_001131f9;
    fdb_doc_free((fdb_doc *)_Var17._M_i);
    _Var17._M_i = auStack_7a8._8_8_;
    _Stack_798._M_i = 0;
    _Var11._M_i = (__int_type)(pbStack_7c0->alc_list).tail;
    sVar9 = strlen((char *)&abStack_b38[4].alc_list.tail);
    fVar7 = fdb_iterator_seek((fdb_iterator *)_Var17._M_i,(void *)_Var11._M_i,sVar9,'\0');
    if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113204;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var19._M_i = _Stack_798._M_i;
    pbVar54 = pbStack_7c0;
    puVar6 = auStack_c38;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113209;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)(pbStack_7c0->alc_list).tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    if (iVar8 != 0) goto LAB_0011320e;
    _Var11._M_i = *(__int_type *)(_Var19._M_i + 0x38);
    pcVar51 = (char *)pbVar54->file;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var19._M_i + 8));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_00113219;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var19._M_i + 0x40))->seqtree;
    pcVar51 = (char *)pbVar54->log_callback;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var19._M_i + 0x10));
    if (iVar8 != 0) goto LAB_00113224;
    fdb_doc_free((fdb_doc *)_Var19._M_i);
    _Var19._M_i = auStack_7a8._8_8_;
    _Stack_798._M_i = 0;
    _Var11._M_i = (__int_type)((list *)(auStack_820._24_8_ + 0x18))->tail;
    sVar9 = strlen((char *)&abStack_b38[4].alc_list.tail);
    fVar7 = fdb_iterator_seek((fdb_iterator *)_Var19._M_i,(void *)_Var11._M_i,sVar9,'\0');
    puVar6 = auStack_c38;
    if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011322f;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var17._M_i = _Stack_798._M_i;
    _Var12._M_i = auStack_820._24_8_;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113234;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)((list *)(auStack_820._24_8_ + 0x18))->tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_00113239;
    _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
    pcVar51 = *(char **)(_Var12._M_i + 0x38);
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
    if (iVar8 != 0) goto LAB_00113244;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
    pcVar51 = *(char **)(_Var12._M_i + 0x40);
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var17._M_i + 0x10));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_0011324f;
    fdb_doc_free((fdb_doc *)_Var17._M_i);
    _Var17._M_i = auStack_7a8._8_8_;
    _Stack_798._M_i = 0;
    _Var11._M_i = (__int_type)(apbStack_800[1]->alc_list).tail;
    sVar9 = strlen((char *)&abStack_b38[4].alc_list.tail);
    fVar7 = fdb_iterator_seek((fdb_iterator *)_Var17._M_i,(void *)_Var11._M_i,sVar9,'\0');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011325a;
    pcVar56 = (char *)0x2;
    _Var19._M_i = _Var11._M_i;
    do {
      fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
      _Var11._M_i = _Stack_798._M_i;
      pfVar18 = (fdb_kvs_handle *)_Var17._M_i;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113138;
      pcVar51 = *(char **)(_Stack_798._M_i + 0x20);
      _Var17._M_i = (__int_type)
                    apbStack_800[(long)&((filemgr *)((long)pcVar56 + -0x2f0))->field_0x2ef];
      _Var12._M_i = (__int_type)((fdb_kvs_handle *)_Var17._M_i)->op_stats;
      iVar8 = bcmp(pcVar51,(void *)_Var12._M_i,*(size_t *)_Stack_798._M_i);
      if (iVar8 != 0) goto LAB_0011312d;
      pcVar51 = *(char **)(_Var11._M_i + 0x38);
      _Var12._M_i = (__int_type)((fdb_kvs_handle *)_Var17._M_i)->staletree;
      iVar8 = bcmp(pcVar51,(void *)_Var12._M_i,(size_t)*(fdb_custom_cmp_variable *)(_Var11._M_i + 8)
                  );
      pfVar18 = (fdb_kvs_handle *)_Var17._M_i;
      if (iVar8 != 0) goto LAB_00113148;
      pcVar51 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var11._M_i + 0x40))->
                        seqtree;
      _Var12._M_i = (__int_type)(((fdb_kvs_handle *)_Var17._M_i)->field_6).seqtree;
      iVar8 = bcmp(pcVar51,(void *)_Var12._M_i,(size_t)*(void **)(_Var11._M_i + 0x10));
      if (iVar8 != 0) goto LAB_0011313d;
      fdb_doc_free((fdb_doc *)_Var11._M_i);
      _Stack_798._M_i = 0;
      pcVar56 = &((fdb_kvs_config *)&((filemgr *)pcVar56)->filename)->field_0x1;
      fVar7 = fdb_iterator_next((fdb_iterator *)auStack_7a8._8_8_);
      pfVar18 = (fdb_kvs_handle *)auStack_7a8._8_8_;
      _Var19._M_i = _Var11._M_i;
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    puVar6 = auStack_c38;
    if ((uint8_t *)pcVar56 != (uint8_t *)0xa) goto LAB_0011325f;
    _Var11._M_i = (__int_type)(apbStack_800[2]->alc_list).tail;
    sVar9 = strlen((char *)&abStack_b38[4].alc_list.tail);
    fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar18,(void *)_Var11._M_i,sVar9,'\0');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113264;
    pcVar56 = (char *)0x3;
    _Var17._M_i = _Var11._M_i;
    do {
      fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
      _Var11._M_i = _Stack_798._M_i;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011315e;
      pcVar51 = *(char **)(_Stack_798._M_i + 0x20);
      pfVar18 = (fdb_kvs_handle *)
                apbStack_800[(long)&((filemgr *)((long)pcVar56 + -0x2f0))->field_0x2ef];
      _Var12._M_i = (__int_type)pfVar18->op_stats;
      iVar8 = bcmp(pcVar51,(void *)_Var12._M_i,*(size_t *)_Stack_798._M_i);
      if (iVar8 != 0) goto LAB_00113153;
      pcVar51 = *(char **)(_Var11._M_i + 0x38);
      _Var12._M_i = (__int_type)pfVar18->staletree;
      iVar8 = bcmp(pcVar51,(void *)_Var12._M_i,(size_t)*(fdb_custom_cmp_variable *)(_Var11._M_i + 8)
                  );
      if (iVar8 != 0) goto LAB_0011316e;
      pcVar51 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var11._M_i + 0x40))->
                        seqtree;
      _Var12._M_i = (__int_type)(pfVar18->field_6).seqtree;
      iVar8 = bcmp(pcVar51,(void *)_Var12._M_i,(size_t)*(void **)(_Var11._M_i + 0x10));
      if (iVar8 != 0) goto LAB_00113163;
      fdb_doc_free((fdb_doc *)_Var11._M_i);
      _Stack_798._M_i = 0;
      pcVar56 = &((fdb_kvs_config *)&((filemgr *)pcVar56)->filename)->field_0x1;
      fVar7 = fdb_iterator_next((fdb_iterator *)auStack_7a8._8_8_);
      _Var17._M_i = _Var11._M_i;
    } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
    puVar6 = auStack_c38;
    if ((uint8_t *)pcVar56 != (uint8_t *)0xa) goto LAB_00113269;
    pfVar18 = (fdb_kvs_handle *)(auStack_7a8 + 8);
    fdb_iterator_close((fdb_iterator *)auStack_7a8._8_8_);
    _Var11._M_i = (__int_type)&abStack_b38[4].alc_list.tail;
    sprintf((char *)_Var11._M_i,"key%d",4);
    _Var12._M_i = (__int_type)abStack_b38;
    sprintf((char *)_Var12._M_i,"key%d",8);
    pcVar51 = (char *)auStack_7a8._0_8_;
    pcVar56 = (char *)strlen((char *)_Var11._M_i);
    sVar9 = strlen((char *)_Var12._M_i);
    uStack_c50 = 0x112be2;
    fVar7 = fdb_iterator_init((fdb_kvs_handle *)pcVar51,(fdb_iterator **)pfVar18,(void *)_Var11._M_i
                              ,(size_t)pcVar56,(void *)_Var12._M_i,sVar9,2);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011326e;
    fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_7a8._8_8_);
    puVar6 = auStack_c38;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113273;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var20._M_i = _Stack_798._M_i;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113278;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)(pbStack_7c8->alc_list).tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    puVar6 = auStack_c38;
    _Var12._M_i = (__int_type)pbStack_7c8;
    if (iVar8 != 0) goto LAB_0011327d;
    _Var11._M_i = *(__int_type *)(_Var20._M_i + 0x38);
    pcVar51 = (char *)pbStack_7c8->file;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
    if (iVar8 != 0) goto LAB_00113288;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
    pcVar51 = (char *)pbStack_7c8->log_callback;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var20._M_i + 0x10));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_00113293;
    fdb_doc_free((fdb_doc *)_Var20._M_i);
    _Stack_798._M_i = 0;
    fVar7 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_7a8._8_8_);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011329e;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var17._M_i = _Stack_798._M_i;
    puVar6 = auStack_c38;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132a3;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)(apbStack_800[3]->alc_list).tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    _Var12._M_i = (__int_type)apbStack_800[3];
    if (iVar8 != 0) goto LAB_001132a8;
    _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
    pcVar51 = (char *)apbStack_800[3]->file;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_001132b3;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
    pcVar51 = (char *)apbStack_800[3]->log_callback;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var17._M_i + 0x10));
    if (iVar8 != 0) goto LAB_001132be;
    fdb_doc_free((fdb_doc *)_Var17._M_i);
    _Stack_798._M_i = 0;
    fVar7 = fdb_iterator_close((fdb_iterator *)auStack_7a8._8_8_);
    puVar6 = auStack_c38;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132c9;
    uStack_c50 = 0x112d56;
    fVar7 = fdb_iterator_init((fdb_kvs_handle *)auStack_7a8._0_8_,(fdb_iterator **)(auStack_7a8 + 8)
                              ,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132ce;
    fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_7a8._8_8_);
    puVar6 = auStack_c38;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132d3;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var12._M_i = _Stack_798._M_i;
    doc_03 = (char *)pbStack_7c0;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132d8;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)(pbStack_7c0->alc_list).tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_001132dd;
    _Var11._M_i = *(__int_type *)(_Var12._M_i + 0x38);
    pcVar51 = (char *)((btreeblk_handle *)doc_03)->file;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var12._M_i + 8));
    if (iVar8 != 0) goto LAB_001132e8;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var12._M_i + 0x40))->seqtree;
    pcVar51 = (char *)((btreeblk_handle *)doc_03)->log_callback;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var12._M_i + 0x10));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_001132f3;
    fdb_doc_free((fdb_doc *)_Var12._M_i);
    _Stack_798._M_i = 0;
    fVar7 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_7a8._8_8_);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001132fe;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var20._M_i = _Stack_798._M_i;
    puVar6 = auStack_c38;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113303;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)((list *)(auStack_820._24_8_ + 0x18))->tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    doc_03 = (char *)auStack_820._24_8_;
    if (iVar8 != 0) goto LAB_00113308;
    _Var11._M_i = *(__int_type *)(_Var20._M_i + 0x38);
    pcVar51 = *(char **)(auStack_820._24_8_ + 0x38);
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
    puVar6 = auStack_c38;
    if (iVar8 != 0) goto LAB_00113313;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
    pcVar51 = *(char **)(auStack_820._24_8_ + 0x40);
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var20._M_i + 0x10));
    if (iVar8 != 0) goto LAB_0011331e;
    fdb_doc_free((fdb_doc *)_Var20._M_i);
    _Stack_798._M_i = 0;
    _Var20._M_i = (__int_type)afStack_10bb8;
    memset((void *)_Var20._M_i,0xff,0xff80);
    fVar7 = fdb_iterator_seek((fdb_iterator *)auStack_7a8._8_8_,(void *)_Var20._M_i,0xff80,'\x01');
    pfVar48 = (fdb_kvs_handle *)_Var20._M_i;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113329;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var12._M_i = _Stack_798._M_i;
    pfVar18 = (fdb_kvs_handle *)_Var20._M_i;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011332e;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)(pbStack_7c0->alc_list).tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    doc_03 = (char *)pbStack_7c0;
    if (iVar8 != 0) goto LAB_00113333;
    _Var11._M_i = *(__int_type *)(_Var12._M_i + 0x38);
    pcVar51 = (char *)pbStack_7c0->file;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var12._M_i + 8));
    if (iVar8 != 0) goto LAB_0011333e;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var12._M_i + 0x40))->seqtree;
    pcVar51 = (char *)pbStack_7c0->log_callback;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var12._M_i + 0x10));
    if (iVar8 != 0) goto LAB_00113349;
    fdb_doc_free((fdb_doc *)_Var12._M_i);
    _Stack_798._M_i = 0;
    fVar7 = fdb_iterator_close((fdb_iterator *)auStack_7a8._8_8_);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113354;
    pfVar18 = (fdb_kvs_handle *)0xfffffffffffffffe;
    do {
      fVar7 = fdb_del((fdb_kvs_handle *)auStack_7a8._0_8_,
                      (fdb_doc *)apbStack_800[(long)&(pfVar18->kvs_config).field_0x1]);
      _Var12._M_i = (__int_type)pbStack_7c0;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00113179;
      pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x2;
    } while (pfVar18 < (undefined1 *)0x8);
    fdb_commit((fdb_file_handle *)auStack_7b0,'\0');
    fdb_iterator_init((fdb_kvs_handle *)auStack_7a8._0_8_,(fdb_iterator **)(auStack_7a8 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    _Var12._M_i = auStack_7a8._8_8_;
    _Stack_798._M_i = 0;
    _Var11._M_i = (__int_type)(apbStack_800[1]->alc_list).tail;
    sVar9 = strlen((char *)&abStack_b38[4].alc_list.tail);
    fVar7 = fdb_iterator_seek((fdb_iterator *)_Var12._M_i,(void *)_Var11._M_i,sVar9,'\0');
    if (fVar7 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113359;
    fVar7 = fdb_iterator_get((fdb_iterator *)auStack_7a8._8_8_,(fdb_doc **)&_Stack_798);
    _Var17._M_i = _Stack_798._M_i;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011335e;
    _Var11._M_i = *(__int_type *)(_Stack_798._M_i + 0x20);
    pcVar51 = (char *)(apbStack_800[1]->alc_list).tail;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,*(size_t *)_Stack_798._M_i);
    doc_03 = (char *)apbStack_800[1];
    if (iVar8 != 0) goto LAB_00113363;
    _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
    pcVar51 = (char *)apbStack_800[1]->file;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
    if (iVar8 != 0) goto LAB_0011336e;
    _Var11._M_i = (__int_type)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
    pcVar51 = (char *)apbStack_800[1]->log_callback;
    pfVar52 = (filemgr *)pcVar51;
    iVar8 = bcmp((void *)_Var11._M_i,pcVar51,(size_t)*(void **)(_Var17._M_i + 0x10));
    uVar62 = SUB84(pfVar52,0);
    if (iVar8 != 0) goto LAB_00113379;
    fdb_doc_free((fdb_doc *)_Var17._M_i);
    _Stack_798._M_i = 0;
    fVar7 = fdb_iterator_close((fdb_iterator *)auStack_7a8._8_8_);
    uVar14 = (uint)auStack_7a8._8_8_;
    if (fVar7 == FDB_RESULT_SUCCESS) {
      fdb_kvs_close((fdb_kvs_handle *)_Stack_7b8._M_i);
      fdb_kvs_close((fdb_kvs_handle *)auStack_7a8._0_8_);
      fdb_close((fdb_file_handle *)auStack_7b0);
      lVar16 = 0;
      do {
        fdb_doc_free((fdb_doc *)apbStack_800[lVar16 + -1]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 10);
      fdb_shutdown();
      memleak_end();
      pcVar51 = "%s PASSED\n";
      if (iterator_seek_test()::__test_pass != '\0') {
        pcVar51 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar51,"iterator seek test");
      return;
    }
  }
  else {
LAB_0011317e:
    *(undefined8 *)((long)pfVar22 + -8) = 0x113183;
    iterator_seek_test();
    puVar6 = (undefined1 *)pfVar22;
LAB_00113183:
    puVar23 = puVar6;
    *(undefined8 *)(puVar23 + -8) = 0x113188;
    iterator_seek_test();
LAB_00113188:
    pbVar53 = (btreeblk_handle *)_Var12._M_i;
    _Var17._M_i = (__int_type)pfVar18;
    *(undefined8 *)(puVar23 + -8) = 0x11318d;
    iterator_seek_test();
    puVar6 = puVar23;
LAB_0011318d:
    puVar24 = puVar6;
    *(undefined8 *)(puVar24 + -8) = 0x113198;
    iterator_seek_test();
LAB_00113198:
    *(undefined8 *)(puVar24 + -8) = 0x1131a3;
    iterator_seek_test();
    puVar6 = puVar24;
LAB_001131a3:
    puVar25 = puVar6;
    *(undefined8 *)(puVar25 + -8) = 0x1131ae;
    iterator_seek_test();
LAB_001131ae:
    *(undefined8 *)(puVar25 + -8) = 0x1131b3;
    iterator_seek_test();
    puVar6 = puVar25;
LAB_001131b3:
    pbVar54 = pbVar53;
    puVar26 = puVar6;
    _Var12._M_i = _Var17._M_i;
    *(undefined8 *)(puVar26 + -8) = 0x1131b8;
    iterator_seek_test();
LAB_001131b8:
    *(undefined8 *)(puVar26 + -8) = 0x1131c3;
    iterator_seek_test();
    puVar6 = puVar26;
LAB_001131c3:
    puVar27 = puVar6;
    *(undefined8 *)(puVar27 + -8) = 0x1131ce;
    iterator_seek_test();
LAB_001131ce:
    *(undefined8 *)(puVar27 + -8) = 0x1131d9;
    iterator_seek_test();
    puVar6 = puVar27;
LAB_001131d9:
    puVar28 = puVar6;
    *(undefined8 *)(puVar28 + -8) = 0x1131de;
    iterator_seek_test();
LAB_001131de:
    pbVar53 = pbVar54;
    _Var17._M_i = _Var12._M_i;
    *(undefined8 *)(puVar28 + -8) = 0x1131e3;
    iterator_seek_test();
    puVar6 = puVar28;
LAB_001131e3:
    puVar29 = puVar6;
    *(undefined8 *)(puVar29 + -8) = 0x1131ee;
    iterator_seek_test();
LAB_001131ee:
    *(undefined8 *)(puVar29 + -8) = 0x1131f9;
    iterator_seek_test();
    puVar6 = puVar29;
LAB_001131f9:
    puVar30 = puVar6;
    *(undefined8 *)(puVar30 + -8) = 0x113204;
    iterator_seek_test();
LAB_00113204:
    *(undefined8 *)(puVar30 + -8) = 0x113209;
    iterator_seek_test();
    puVar6 = puVar30;
LAB_00113209:
    pbVar54 = pbVar53;
    puVar31 = puVar6;
    _Var19._M_i = _Var17._M_i;
    *(undefined8 *)(puVar31 + -8) = 0x11320e;
    iterator_seek_test();
LAB_0011320e:
    *(undefined8 *)(puVar31 + -8) = 0x113219;
    iterator_seek_test();
    puVar6 = puVar31;
LAB_00113219:
    puVar32 = puVar6;
    *(undefined8 *)(puVar32 + -8) = 0x113224;
    iterator_seek_test();
LAB_00113224:
    *(undefined8 *)(puVar32 + -8) = 0x11322f;
    iterator_seek_test();
    puVar6 = puVar32;
LAB_0011322f:
    puVar33 = puVar6;
    *(undefined8 *)(puVar33 + -8) = 0x113234;
    iterator_seek_test();
LAB_00113234:
    _Var12._M_i = (__int_type)pbVar54;
    _Var17._M_i = _Var19._M_i;
    *(undefined8 *)(puVar33 + -8) = 0x113239;
    iterator_seek_test();
    puVar6 = puVar33;
LAB_00113239:
    puVar34 = puVar6;
    *(undefined8 *)(puVar34 + -8) = 0x113244;
    iterator_seek_test();
LAB_00113244:
    *(undefined8 *)(puVar34 + -8) = 0x11324f;
    iterator_seek_test();
    puVar6 = puVar34;
LAB_0011324f:
    puVar35 = puVar6;
    *(undefined8 *)(puVar35 + -8) = 0x11325a;
    iterator_seek_test();
LAB_0011325a:
    *(undefined8 *)(puVar35 + -8) = 0x11325f;
    iterator_seek_test();
    puVar6 = puVar35;
LAB_0011325f:
    puVar36 = puVar6;
    pfVar18 = (fdb_kvs_handle *)_Var17._M_i;
    *(undefined8 *)(puVar36 + -8) = 0x113264;
    iterator_seek_test();
LAB_00113264:
    *(undefined8 *)(puVar36 + -8) = 0x113269;
    iterator_seek_test();
    puVar6 = puVar36;
LAB_00113269:
    puVar37 = puVar6;
    *(undefined8 *)(puVar37 + -8) = 0x11326e;
    iterator_seek_test();
LAB_0011326e:
    *(undefined8 *)(puVar37 + -8) = 0x113273;
    iterator_seek_test();
    puVar6 = puVar37;
LAB_00113273:
    puVar38 = puVar6;
    *(undefined8 *)(puVar38 + -8) = 0x113278;
    iterator_seek_test();
LAB_00113278:
    _Var20._M_i = (__int_type)pfVar18;
    *(undefined8 *)(puVar38 + -8) = 0x11327d;
    iterator_seek_test();
    puVar6 = puVar38;
LAB_0011327d:
    puVar39 = puVar6;
    *(undefined8 *)(puVar39 + -8) = 0x113288;
    iterator_seek_test();
LAB_00113288:
    *(undefined8 *)(puVar39 + -8) = 0x113293;
    iterator_seek_test();
    puVar6 = puVar39;
LAB_00113293:
    puVar40 = puVar6;
    *(undefined8 *)(puVar40 + -8) = 0x11329e;
    iterator_seek_test();
LAB_0011329e:
    *(undefined8 *)(puVar40 + -8) = 0x1132a3;
    iterator_seek_test();
    puVar6 = puVar40;
LAB_001132a3:
    puVar41 = puVar6;
    _Var17._M_i = _Var20._M_i;
    *(undefined8 *)(puVar41 + -8) = 0x1132a8;
    iterator_seek_test();
LAB_001132a8:
    *(undefined8 *)(puVar41 + -8) = 0x1132b3;
    iterator_seek_test();
    puVar6 = puVar41;
LAB_001132b3:
    puVar42 = puVar6;
    *(undefined8 *)(puVar42 + -8) = 0x1132be;
    iterator_seek_test();
LAB_001132be:
    *(undefined8 *)(puVar42 + -8) = 0x1132c9;
    iterator_seek_test();
    puVar6 = puVar42;
LAB_001132c9:
    puVar43 = puVar6;
    *(undefined8 *)(puVar43 + -8) = 0x1132ce;
    iterator_seek_test();
LAB_001132ce:
    *(undefined8 *)(puVar43 + -8) = 0x1132d3;
    iterator_seek_test();
    puVar6 = puVar43;
LAB_001132d3:
    puVar44 = puVar6;
    *(undefined8 *)(puVar44 + -8) = 0x1132d8;
    iterator_seek_test();
    apbStack_800[3] = (btreeblk_handle *)_Var12._M_i;
LAB_001132d8:
    doc_03 = (char *)apbStack_800[3];
    _Var12._M_i = _Var17._M_i;
    *(undefined8 *)(puVar44 + -8) = 0x1132dd;
    iterator_seek_test();
    puVar6 = puVar44;
LAB_001132dd:
    puVar45 = puVar6;
    *(undefined8 *)(puVar45 + -8) = 0x1132e8;
    iterator_seek_test();
LAB_001132e8:
    *(undefined8 *)(puVar45 + -8) = 0x1132f3;
    iterator_seek_test();
    puVar6 = puVar45;
LAB_001132f3:
    puVar46 = puVar6;
    *(undefined8 *)(puVar46 + -8) = 0x1132fe;
    iterator_seek_test();
LAB_001132fe:
    *(undefined8 *)(puVar46 + -8) = 0x113303;
    iterator_seek_test();
    puVar6 = puVar46;
LAB_00113303:
    puVar47 = puVar6;
    _Var20._M_i = _Var12._M_i;
    *(undefined8 *)(puVar47 + -8) = 0x113308;
    iterator_seek_test();
LAB_00113308:
    *(undefined8 *)(puVar47 + -8) = 0x113313;
    iterator_seek_test();
    puVar6 = puVar47;
LAB_00113313:
    pfVar48 = (fdb_kvs_handle *)puVar6;
    *(undefined8 *)((long)pfVar48 + -8) = 0x11331e;
    iterator_seek_test();
LAB_0011331e:
    *(undefined8 *)((long)pfVar48 + -8) = 0x113329;
    iterator_seek_test();
LAB_00113329:
    pfVar48[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11332e;
    iterator_seek_test();
    pfVar18 = (fdb_kvs_handle *)_Var20._M_i;
    _Var20._M_i = (__int_type)pfVar48;
LAB_0011332e:
    _Var12._M_i = (__int_type)pfVar18;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113333;
    iterator_seek_test();
LAB_00113333:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11333e;
    iterator_seek_test();
LAB_0011333e:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113349;
    iterator_seek_test();
LAB_00113349:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113354;
    iterator_seek_test();
LAB_00113354:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113359;
    iterator_seek_test();
LAB_00113359:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11335e;
    iterator_seek_test();
LAB_0011335e:
    _Var17._M_i = _Var12._M_i;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113363;
    iterator_seek_test();
LAB_00113363:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11336e;
    iterator_seek_test();
LAB_0011336e:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113379;
    iterator_seek_test();
LAB_00113379:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113384;
    pfVar18 = (fdb_kvs_handle *)_Var11._M_i;
    pfVar52 = (filemgr *)pcVar51;
    iterator_seek_test();
    uVar14 = (uint)pfVar52;
    uVar62 = SUB84(pfVar18,0);
  }
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle =
       (fdb_kvs_handle *)iterator_complete_test;
  iterator_seek_test();
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)&aStack_768;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).space_used = (uint64_t)pcVar51;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).num_entries = _Var11._M_i;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).entries = (list *)pcVar56;
  *(char **)&((fdb_kvs_handle *)(_Var20._M_i + -0x208))->num_iterators = doc_03;
  ((fdb_kvs_handle *)(_Var20._M_i + -0x208))->node = (kvs_opened_node *)_Var17._M_i;
  *(undefined4 *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
       = uVar62;
  pfVar18 = (fdb_kvs_handle *)(ulong)uVar14;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133b0;
  gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x208))->config).compaction_cb_mask,
               (__timezone_ptr_t)0x0);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
  ((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node = (kvs_opened_node *)0x202066722d206d72;
  *(undefined8 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->num_iterators = 0x726f746172657469;
  *(undefined8 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->field_0x1e7 = 0x2a747365745f72;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133de;
  system((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133e3;
  memleak_start();
  fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x208))->config).max_writer_lock_prob;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133f3;
  fdb_get_default_config();
  *(undefined4 *)
   ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x208))->config).num_bgflusher_threads + 4) = 1;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113407;
  fdb_get_default_kvs_config();
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11341b;
  fVar7 = fdb_open((fdb_file_handle **)
                   ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4),
                   "./iterator_test",(fdb_config *)fconfig);
  if (fVar7 != FDB_RESULT_SUCCESS) {
LAB_001151a6:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151ab;
    iterator_complete_test();
LAB_001151ab:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151b0;
    iterator_complete_test();
LAB_001151b0:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151b5;
    iterator_complete_test();
LAB_001151b5:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151ba;
    iterator_complete_test();
LAB_001151ba:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151bf;
    iterator_complete_test();
LAB_001151bf:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151c4;
    iterator_complete_test();
LAB_001151c4:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151c9;
    iterator_complete_test();
LAB_001151c9:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151ce;
    iterator_complete_test();
LAB_001151ce:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151d3;
    iterator_complete_test();
LAB_001151d3:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151d8;
    iterator_complete_test();
LAB_001151d8:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151dd;
    iterator_complete_test();
LAB_001151dd:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151e2;
    iterator_complete_test();
LAB_001151e2:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151e7;
    iterator_complete_test();
LAB_001151e7:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151ec;
    iterator_complete_test();
LAB_001151ec:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151f1;
    iterator_complete_test();
LAB_001151f1:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151f6;
    iterator_complete_test();
LAB_001151f6:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151fb;
    iterator_complete_test();
LAB_001151fb:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115200;
    iterator_complete_test();
LAB_00115200:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115205;
    iterator_complete_test();
LAB_00115205:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115215;
    iterator_complete_test();
LAB_00115215:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11521a;
    iterator_complete_test();
LAB_0011521a:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11521f;
    iterator_complete_test();
LAB_0011521f:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115224;
    iterator_complete_test();
LAB_00115224:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115229;
    iterator_complete_test();
LAB_00115229:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115239;
    iterator_complete_test();
LAB_00115239:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11523e;
    iterator_complete_test();
LAB_0011523e:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115243;
    iterator_complete_test();
LAB_00115243:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115248;
    iterator_complete_test();
    pfVar52 = (filemgr *)pcVar56;
LAB_00115248:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11524d;
    iterator_complete_test();
LAB_0011524d:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115252;
    iterator_complete_test();
LAB_00115252:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115257;
    iterator_complete_test();
LAB_00115257:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11525c;
    iterator_complete_test();
LAB_0011525c:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115261;
    iterator_complete_test();
LAB_00115261:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115266;
    iterator_complete_test();
LAB_00115266:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11526b;
    iterator_complete_test();
    pfVar48 = pfVar18;
LAB_0011526b:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115270;
    iterator_complete_test();
LAB_00115270:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115275;
    iterator_complete_test();
    pfVar18 = pfVar48;
LAB_00115275:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11527a;
    iterator_complete_test();
LAB_0011527a:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11527f;
    iterator_complete_test();
LAB_0011527f:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115284;
    iterator_complete_test();
LAB_00115284:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115289;
    iterator_complete_test();
LAB_00115289:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11528e;
    iterator_complete_test();
LAB_0011528e:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115293;
    iterator_complete_test();
LAB_00115293:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115298;
    iterator_complete_test();
LAB_00115298:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
         iterator_extreme_key_test;
    iterator_complete_test();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = pcVar51;
    *(fdb_kvs_handle **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_mask =
         pfVar18;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb =
         (fdb_compaction_callback)pfVar52;
    *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_wal_partitions = doc_03;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).prefetch_duration = (uint64_t)fconfig;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1152b9;
    gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).num_wal_partitions
                 ,(__timezone_ptr_t)0x0);
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).durability_opt = '\0';
    *(undefined2 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).field_0x22 = 0;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).flags = 0;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x820))->filename = (char *)0x202066722d206d72;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x820))->txn = (fdb_txn *)0x726f746172657469;
    *(undefined8 *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x820))->txn + 7) = 0x2a747365745f72;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1152e7;
    system((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x820))->filename);
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1152ec;
    memleak_start();
    fconfig_00 = (atomic<unsigned_char> *)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xa28))->config).compaction_cb_mask;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1152fc;
    fdb_get_default_config();
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115306;
    fdb_get_default_kvs_config();
    pfVar48 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_minimum_filesize;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11531a;
    fVar7 = fdb_open((fdb_file_handle **)pfVar48,"./iterator_test",(fdb_config *)fconfig_00);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      pfVar48 = (fdb_kvs_handle *)
                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115338;
      fVar7 = fdb_kvs_open((fdb_file_handle *)pfVar48,
                           (fdb_kvs_handle **)
                           &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                            compaction_buf_maxsize,(char *)0x0,
                           (fdb_kvs_config *)
                           &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                            compactor_sleep_duration);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115734;
      fconfig_00 = &((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->handle_busy;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11535a;
      memset(fconfig_00,0xff,0x100);
      uVar55 = 1;
      pcVar51 = "0xff length %d";
      doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask;
      do {
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11537c;
        sprintf(doc_03,"0xff length %d",uVar55 & 0xffffffff);
        pfVar52 = *(filemgr **)
                   &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_buf_maxsize;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115389;
        sVar9 = strlen(doc_03);
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11539e;
        fdb_set_kv((fdb_kvs_handle *)pfVar52,fconfig_00,uVar55,doc_03,sVar9 + 1);
        uVar55 = uVar55 + 1;
      } while (uVar55 != 0x1e);
      pfVar15 = (fdb_file_handle *)
                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1153b6;
      fdb_commit(pfVar15,'\x01');
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold = 0;
      pfVar48 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1153d4;
      fVar7 = fdb_doc_create((fdb_doc **)pfVar48,(void *)0x0,0,(void *)0x0,0,(void *)0x0,
                             (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold);
      pfVar18 = (fdb_kvs_handle *)0x1e;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115739;
      lVar16 = *(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      *(uint16_t **)(lVar16 + 0x20) =
           &(((fdb_kvs_handle *)(_Var20._M_i + -0x820))->config).num_wal_partitions;
      *(undefined8 *)(lVar16 + 0x38) = 0;
      *(fdb_txn ***)(lVar16 + 0x40) = &((fdb_kvs_handle *)(_Var20._M_i + -0xa28))->txn;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_buf_maxsize;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold = 0;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115421;
      fVar7 = fdb_iterator_init(pfVar48,(fdb_iterator **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                         wal_flush_before_commit,(void *)0x0,0,(void *)0x0,0,
                                (fdb_iterator_opt_t)
                                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011573e;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115433;
      fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar48);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115743;
      fconfig_00 = (atomic<unsigned_char> *)0x1d;
      do {
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11545e;
        fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                         seqtree_opt);
        if (fVar7 != FDB_RESULT_SUCCESS) break;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115471;
        sprintf((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask,
                "0xff length %d",fconfig_00);
        sVar9 = *(size_t *)
                 (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt + 0x10)
        ;
        pfVar52 = *(filemgr **)
                   (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                   0x40);
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115489;
        iVar8 = bcmp(pfVar52,&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                              compaction_cb_mask,sVar9);
        if (iVar8 != 0) {
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115708;
          iterator_extreme_key_test();
          goto LAB_00115708;
        }
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11549b;
        fVar7 = fdb_iterator_prev(pfVar2);
        fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
      } while (fVar7 == FDB_RESULT_SUCCESS);
      pfVar2 = *(fdb_iterator **)
                &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1154bd;
      fVar7 = fdb_iterator_seek(pfVar2,&((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->handle_busy,8,
                                '\x01');
      if (fVar7 == FDB_RESULT_SUCCESS) {
        fconfig_00 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1154e4;
          fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                           seqtree_opt);
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1154f7;
          sprintf((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask,
                  "0xff length %d",fconfig_00);
          sVar9 = *(size_t *)
                   (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                   0x10);
          pfVar52 = *(filemgr **)
                     (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                     0x40);
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11550f;
          iVar8 = bcmp(pfVar52,&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                compaction_cb_mask,sVar9);
          if (iVar8 != 0) goto LAB_00115715;
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115521;
          fVar7 = fdb_iterator_prev(pfVar2);
          fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
        } while (fVar7 == FDB_RESULT_SUCCESS);
      }
      pfVar2 = *(fdb_iterator **)
                &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115543;
      fVar7 = fdb_iterator_seek(pfVar2,&((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->handle_busy,8,
                                '\x01');
      if (fVar7 == FDB_RESULT_SUCCESS) {
        fconfig_00 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11556a;
          fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                           seqtree_opt);
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11557d;
          sprintf((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask,
                  "0xff length %d",fconfig_00);
          sVar9 = *(size_t *)
                   (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                   0x10);
          pfVar52 = *(filemgr **)
                     (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                     0x40);
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115595;
          iVar8 = bcmp(pfVar52,&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                compaction_cb_mask,sVar9);
          if (iVar8 != 0) goto LAB_00115722;
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1155a7;
          fVar7 = fdb_iterator_next(pfVar2);
          fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 + 1);
        } while (fVar7 == FDB_RESULT_SUCCESS);
      }
      pfVar18 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask;
      pcVar51 = "0xff length %d";
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1155b7;
      fVar7 = fdb_iterator_close((fdb_iterator *)pfVar48);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115748;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_buf_maxsize;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold = 0;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1155e7;
      fVar7 = fdb_iterator_init(pfVar48,(fdb_iterator **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                         wal_flush_before_commit,(void *)0x0,0,
                                &((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->handle_busy,0x100,
                                (fdb_iterator_opt_t)
                                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011574d;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1155f9;
      fVar7 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar48);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115752;
      fconfig_00 = (atomic<unsigned_char> *)0x1d;
      pfVar18 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      pcVar51 = "0xff length %d";
      doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask;
      do {
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115624;
        fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)pfVar18);
        if (fVar7 != FDB_RESULT_SUCCESS) break;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115637;
        sprintf(doc_03,"0xff length %d",fconfig_00);
        sVar9 = *(size_t *)
                 (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt + 0x10)
        ;
        pfVar52 = *(filemgr **)
                   (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                   0x40);
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11564f;
        iVar8 = bcmp(pfVar52,doc_03,sVar9);
        if (iVar8 != 0) goto LAB_00115708;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115661;
        fVar7 = fdb_iterator_prev(pfVar2);
        fconfig_00 = (atomic<unsigned_char> *)(ulong)((int)fconfig_00 - 1);
      } while (fVar7 == FDB_RESULT_SUCCESS);
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115671;
      fVar7 = fdb_iterator_close((fdb_iterator *)pfVar48);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115757;
      pfVar48 = (fdb_kvs_handle *)
                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115683;
      fVar7 = fdb_close((fdb_file_handle *)pfVar48);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011575c;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      pfVar48->op_stats = (kvs_ops_stat *)0x0;
      (pfVar48->field_6).seqtree = (btree *)0x0;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11569f;
      fVar7 = fdb_doc_free((fdb_doc *)pfVar48);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115761;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1156ac;
      fVar7 = fdb_shutdown();
      if (fVar7 == FDB_RESULT_SUCCESS) {
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1156b9;
        memleak_end();
        pcVar51 = "%s PASSED\n";
        if (iterator_extreme_key_test()::__test_pass != '\0') {
          pcVar51 = "%s FAILED\n";
        }
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1156ea;
        fprintf(_stderr,pcVar51,"iterator extreme key test");
        return;
      }
    }
    else {
LAB_0011572f:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115734;
      iterator_extreme_key_test();
LAB_00115734:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115739;
      iterator_extreme_key_test();
LAB_00115739:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11573e;
      iterator_extreme_key_test();
LAB_0011573e:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115743;
      iterator_extreme_key_test();
LAB_00115743:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115748;
      iterator_extreme_key_test();
LAB_00115748:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11574d;
      iterator_extreme_key_test();
LAB_0011574d:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115752;
      iterator_extreme_key_test();
LAB_00115752:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115757;
      iterator_extreme_key_test();
LAB_00115757:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11575c;
      iterator_extreme_key_test();
LAB_0011575c:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115761;
      iterator_extreme_key_test();
LAB_00115761:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115766;
      iterator_extreme_key_test();
    }
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size =
         (uint64_t)iterator_inmem_snapshot_seek_test;
    iterator_extreme_key_test();
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = (uint64_t)pcVar50;
    *(char **)&((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config = pcVar51;
    ((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->fileops = (filemgr_ops *)pfVar18;
    ((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->btreeblkops = (btree_blk_ops *)pfVar52;
    ((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->bhandle = (btreeblk_handle *)doc_03;
    ((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->dhandle = (docio_handle *)fconfig_00;
    sVar9 = (ulong)pfVar48 & 0xffffffff;
    pvVar59 = (void *)0x0;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115790;
    gettimeofday((timeval *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->bhandle,
                 (__timezone_ptr_t)0x0);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115795;
    memleak_start();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).num_entries = 0;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1157a6;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar21 = (fdb_doc *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->config).num_blocks_readahead;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1157b6;
    fdb_get_default_config();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1157c0;
    fdb_get_default_kvs_config();
    (((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->log_callback).callback = (fdb_log_callback)0x0;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->log_callback).callback_ex =
         (fdb_log_callback_ex)0x400;
    *(undefined4 *)
     ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->cur_header_revnum).
             super___atomic_base<unsigned_long>._M_i + 4) = 1;
    *(undefined1 *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->rollback_revnum + 7) = 0;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1157eb;
    fVar7 = fdb_open((fdb_file_handle **)(_Var20._M_i + -0x1040),"./iterator_test1",
                     (fdb_config *)pfVar21);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(int *)((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config).custom_cmp + 4) =
           (int)pfVar48;
      pfVar18 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11580b;
      fVar7 = fdb_kvs_open_default
                        ((fdb_file_handle *)pfVar18,
                         &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle,
                         (fdb_kvs_config *)
                         &(((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config).custom_cmp_param
                        );
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c00;
      pfVar52 = (filemgr *)0x0;
      uVar55 = 0;
      do {
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115836;
        sprintf((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->btreeblkops,"%c2",
                (ulong)((int)uVar55 + 0x61));
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11584f;
        sprintf((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->log_callback,"meta%d",
                uVar55 & 0xffffffff);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115868;
        sprintf((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->fileops,"body%d",
                uVar55 & 0xffffffff);
        doc_03 = (char *)(_Var20._M_i + (long)pfVar52 + -0x1018);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115878;
        sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->btreeblkops);
        pfVar21 = (fdb_doc *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->log_callback;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11588b;
        pcVar51 = (char *)strlen((char *)pfVar21);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11589b;
        sVar10 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->fileops);
        *(size_t *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators = sVar10;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1158c0;
        fdb_doc_create((fdb_doc **)doc_03,&((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->btreeblkops,
                       sVar9,pfVar21,(size_t)pcVar51,
                       &((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->fileops,
                       *(size_t *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators);
        pfVar18 = (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle;
        doc = *(fdb_doc **)(_Var20._M_i + uVar55 * 8 + -0x1018);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1158cf;
        fdb_set(pfVar18,doc);
        uVar55 = uVar55 + 1;
        pfVar52 = (filemgr *)((long)pfVar52 + 8);
      } while (uVar55 != 5);
      pfVar18 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config;
      opt = *(fdb_commit_opt_t *)
             ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config).custom_cmp + 4);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1158ef;
      fdb_commit((fdb_file_handle *)pfVar18,opt);
      pfVar18 = (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115905;
      fVar7 = fdb_snapshot_open(pfVar18,(fdb_kvs_handle **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).
                                         space_used,0xffffffffffffffff);
      pvVar59 = (void *)0x5;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c05;
      pfVar18 = (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115925;
      fVar7 = fdb_set_log_callback(pfVar18,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c0a;
      pfVar18 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators = 0xe;
      pfVar21 = (fdb_doc *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11595f;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar21,"b2",2,"d2",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators);
      pfVar2 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115978;
      fVar7 = fdb_iterator_seek(pfVar2,"c1",2,'\x01');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c0f;
      pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115999;
      fVar7 = fdb_iterator_seek(pfVar2,"c3",2,'\0');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c14;
      pfVar21 = (fdb_doc *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx;
      pfVar2 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1159af;
      fdb_iterator_close(pfVar2);
      pfVar18 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators = 0xe;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1159dc;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar21,"b3",2,"d1",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators);
      pfVar2 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1159f5;
      fVar7 = fdb_iterator_seek(pfVar2,"c1",2,'\x01');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c19;
      pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a16;
      fVar7 = fdb_iterator_seek(pfVar2,"c3",2,'\0');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c1e;
      pfVar21 = (fdb_doc *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx;
      pfVar2 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a2c;
      fdb_iterator_close(pfVar2);
      pfVar18 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators = 0xe;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a59;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar21,"b0",2,"e2",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators);
      pfVar2 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a61;
      fVar7 = fdb_iterator_seek_to_max(pfVar2);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c23;
      pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a78;
      fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).
                                       num_entries);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c28;
      pfVar21 = (fdb_doc *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).num_entries;
      sVar10 = pfVar21->keylen;
      pvVar59 = pfVar21->key;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a9b;
      iVar8 = bcmp(pvVar59,"d2",sVar10);
      if (iVar8 != 0) goto LAB_00115c2d;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115aab;
      fdb_doc_free(pfVar21);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).num_entries = 0;
      pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115acc;
      fVar7 = fdb_iterator_seek(pfVar2,"e2",2,'\0');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c35;
      pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115adf;
      fVar7 = fdb_iterator_seek_to_min(pfVar2);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c3a;
      pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115af6;
      fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).
                                       num_entries);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115c3f;
      pfVar21 = (fdb_doc *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).num_entries;
      sVar10 = pfVar21->keylen;
      pvVar59 = pfVar21->key;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b19;
      iVar8 = bcmp(pvVar59,"c2",sVar10);
      if (iVar8 != 0) goto LAB_00115c44;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b29;
      fdb_doc_free(pfVar21);
      pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b44;
      fVar7 = fdb_iterator_seek(pfVar2,"b0",2,'\x01');
      if (fVar7 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c4c;
      pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b68;
      fVar7 = fdb_iterator_seek(pfVar2,"b0",2,'\x01');
      if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar2 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b7b;
        fdb_iterator_close(pfVar2);
        pfVar18 = (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b85;
        fdb_kvs_close(pfVar18);
        pfVar18 = (fdb_kvs_handle *)
                  (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).space_used;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b8f;
        fdb_kvs_close(pfVar18);
        pfVar18 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b99;
        fdb_close((fdb_file_handle *)pfVar18);
        lVar16 = 0;
        do {
          pfVar21 = *(fdb_doc **)(_Var20._M_i + lVar16 * 8 + -0x1018);
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115ba5;
          fdb_doc_free(pfVar21);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 5);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115bb3;
        fdb_shutdown();
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115bb8;
        memleak_end();
        pcVar51 = "%s PASSED\n";
        if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
          pcVar51 = "%s FAILED\n";
        }
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115be9;
        fprintf(_stderr,pcVar51,"in-memory snapshot seek test");
        return;
      }
    }
    else {
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c00;
      iterator_inmem_snapshot_seek_test();
LAB_00115c00:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c05;
      iterator_inmem_snapshot_seek_test();
LAB_00115c05:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c0a;
      iterator_inmem_snapshot_seek_test();
LAB_00115c0a:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c0f;
      iterator_inmem_snapshot_seek_test();
LAB_00115c0f:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c14;
      iterator_inmem_snapshot_seek_test();
LAB_00115c14:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c19;
      iterator_inmem_snapshot_seek_test();
LAB_00115c19:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c1e;
      iterator_inmem_snapshot_seek_test();
LAB_00115c1e:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c23;
      iterator_inmem_snapshot_seek_test();
LAB_00115c23:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c28;
      iterator_inmem_snapshot_seek_test();
LAB_00115c28:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c2d;
      iterator_inmem_snapshot_seek_test();
LAB_00115c2d:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c35;
      iterator_inmem_snapshot_seek_test();
LAB_00115c35:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c3a;
      iterator_inmem_snapshot_seek_test();
LAB_00115c3a:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c3f;
      iterator_inmem_snapshot_seek_test();
LAB_00115c3f:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c44;
      iterator_inmem_snapshot_seek_test();
LAB_00115c44:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c4c;
      iterator_inmem_snapshot_seek_test();
LAB_00115c4c:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c51;
      iterator_inmem_snapshot_seek_test();
    }
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)iterator_no_deletes_test;
    iterator_inmem_snapshot_seek_test();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)sVar9;
    *(char **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->handle_busy = pcVar51;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->txn = (fdb_txn *)pvVar59;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->filename = (char *)pfVar52;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->max_seqnum = (fdb_seqnum_t)doc_03;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->seqnum = (fdb_seqnum_t)pfVar21;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115c76;
    gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).seqtree_opt,
                 (__timezone_ptr_t)0x0);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115c7b;
    memleak_start();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats = (kvs_ops_stat *)0x0;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115c90;
    system("rm -rf  iterator_test* > errorlog.txt");
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115ca0;
    fdb_get_default_config();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cb0;
    fdb_get_default_kvs_config();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).compaction_cb =
         (fdb_compaction_callback)0x400;
    *(undefined4 *)
     ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).compaction_cb_ctx + 4) = 1;
    *(undefined1 *)
     ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).max_writer_lock_prob + 7) = 0;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cda;
    fdb_open((fdb_file_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->staletree,
             "./iterator_test",
             (fdb_config *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).prefetch_duration)
    ;
    pbVar60 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->staletree;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cf1;
    fdb_kvs_open((fdb_file_handle *)pbVar60,
                 (fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle,"all_docs"
                 ,(fdb_kvs_config *)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).compaction_minimum_filesize
                );
    __s = &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->config).compactor_sleep_duration;
    __s_00 = &((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->seqnum;
    lVar16 = 0;
    uVar55 = 0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d1b;
      sprintf((char *)__s,"key%d",uVar55 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d2f;
      sprintf((char *)__s_00,"body%d",uVar55 & 0xffffffff);
      lVar5 = lVar16 + -0x1410;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d3f;
      sVar9 = strlen((char *)__s);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d4a;
      sVar10 = strlen((char *)__s_00);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp_param = (void *)sVar10;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d64;
      fdb_doc_create((fdb_doc **)(_Var20._M_i + lVar5),__s,sVar9,(void *)0x0,0,__s_00,
                     (size_t)(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).
                             custom_cmp_param);
      pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
      pfVar21 = *(fdb_doc **)(_Var20._M_i + uVar55 * 8 + -0x1410);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d73;
      fdb_set(pfVar18,pfVar21);
      uVar55 = uVar55 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar55 != 10);
    doc_01 = (list *)0x0;
    do {
      pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
      psVar3 = *(size_t **)(_Var20._M_i + (long)doc_01 * 8 + -0x1410);
      keylen = *psVar3;
      pvVar59 = (void *)psVar3[4];
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d98;
      fVar7 = fdb_del_kv(pfVar18,pvVar59,keylen);
      if (fVar7 != FDB_RESULT_SUCCESS) {
        (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115f06;
        iterator_no_deletes_test();
        goto LAB_00115f06;
      }
      doc_01 = (list *)((long)&doc_01->head + 1);
    } while (doc_01 != (list *)0xa);
    pbVar60 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->staletree;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115db5;
    fdb_commit((fdb_file_handle *)pbVar60,'\0');
    pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
    pfVar21 = (fdb_doc *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->dhandle;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115dc4;
    fVar7 = fdb_set(pfVar18,pfVar21);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      pfVar52 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->dhandle->file;
      pvVar59 = (void *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->dhandle->lastBmpRevnum;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp_param = (void *)0x0;
      doc_01 = (list *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115df5;
      fdb_doc_create((fdb_doc **)doc_01,pvVar59,(size_t)pfVar52,(void *)0x0,0,(void *)0x0,
                     (size_t)(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).
                             custom_cmp_param);
      pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
      pfVar21 = *(fdb_doc **)doc_01;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e02;
      fVar7 = fdb_get(pfVar18,pfVar21);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115f0b;
      doc_02 = (hbtrie *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats;
      if (*(char *)&doc_02->map != '\0') {
        doc_01 = (list *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->trie;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115e27;
        iterator_no_deletes_test();
        doc_02 = *(hbtrie **)doc_01;
      }
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e2f;
      fdb_doc_free((fdb_doc *)doc_02);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats = (kvs_ops_stat *)0x0;
      pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp_param = 2
      ;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e58;
      fVar7 = fdb_iterator_init(pfVar18,(fdb_iterator **)
                                        &((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->trie,
                                (void *)0x0,0,(void *)0x0,0,
                                *(fdb_iterator_opt_t *)
                                 &(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).
                                  custom_cmp_param);
      if (fVar7 == FDB_RESULT_SUCCESS) {
        pfVar2 = (fdb_iterator *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->trie;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115e6f;
        fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                        &((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats);
        if (fVar7 == FDB_RESULT_SUCCESS) {
          pfVar21 = (fdb_doc *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115e81;
          fdb_doc_free(pfVar21);
          pfVar2 = (fdb_iterator *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->trie;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115e8b;
          fdb_iterator_close(pfVar2);
          lVar16 = 0;
          do {
            pfVar21 = *(fdb_doc **)(_Var20._M_i + lVar16 * 8 + -0x1410);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
                 (fdb_custom_cmp_variable)0x115e97;
            fdb_doc_free(pfVar21);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 10);
          pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115eaa;
          fdb_kvs_close(pfVar18);
          pbVar60 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->staletree;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115eb4;
          fdb_close((fdb_file_handle *)pbVar60);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115eb9;
          fdb_shutdown();
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115ebe;
          memleak_end();
          pcVar51 = "%s PASSED\n";
          if (iterator_no_deletes_test()::__test_pass != '\0') {
            pcVar51 = "%s FAILED\n";
          }
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115eef;
          fprintf(_stderr,pcVar51,"iterator no deletes test");
          return;
        }
        goto LAB_00115f15;
      }
    }
    else {
LAB_00115f06:
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115f0b;
      iterator_no_deletes_test();
LAB_00115f0b:
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115f10;
      iterator_no_deletes_test();
    }
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115f15;
    iterator_no_deletes_test();
LAB_00115f15:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         iterator_set_del_docs_test;
    iterator_no_deletes_test();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)(_Var20._M_i + lVar5);
    *(long *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config = lVar16;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->bub_ctx).handle = (fdb_kvs_handle *)__s;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->bub_ctx).space_used = 10;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->bub_ctx).num_entries = (uint64_t)__s_00;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->bub_ctx).entries = doc_01;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f37;
    gettimeofday((timeval *)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).multi_kv_instances,
                 (__timezone_ptr_t)0x0);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f3c;
    memleak_start();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f4c;
    fdb_get_default_config();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f5c;
    fdb_get_default_kvs_config();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f68;
    system("rm -rf  iterator_test* > errorlog.txt");
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.algorithm = 0x400;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[0] = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[1] = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[2] = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[3] = '\0';
    pfVar4 = &((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config;
    (pfVar4->encryption_key).bytes[0x10] = '\x01';
    (pfVar4->encryption_key).bytes[0x11] = '\0';
    (pfVar4->encryption_key).bytes[0x12] = '\0';
    (pfVar4->encryption_key).bytes[0x13] = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[0x1b] = '\n';
    pfVar4 = &((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config;
    (pfVar4->encryption_key).bytes[8] = '\x01';
    (pfVar4->encryption_key).bytes[9] = '\0';
    (pfVar4->encryption_key).bytes[10] = '\0';
    (pfVar4->encryption_key).bytes[0xb] = '\0';
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f96;
    fdb_open((fdb_file_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops,
             "./iterator_test1",
             (fdb_config *)
             &(((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).enable_background_compactor);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115fad;
    fdb_kvs_open((fdb_file_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops,
                 (fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,"kv1",
                 (fdb_kvs_config *)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).num_wal_partitions);
    psVar3 = &(((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->config).max_writer_lock_prob;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->bhandle = (btreeblk_handle *)0x0;
    iVar8 = 0;
    do {
      *(int *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->dhandle + 4) = iVar8;
      lVar16 = 0;
      uVar55 = 0;
      do {
        uVar14 = *(uint *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->dhandle + 4);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115fed;
        sprintf((char *)psVar3,"key%02d%03d",(ulong)uVar14,uVar55 & 0xffffffff);
        __s_01 = &((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->bub_ctx;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11600c;
        sprintf((char *)__s_01,"meta%02d%03d",(ulong)uVar14,uVar55 & 0xffffffff);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116023;
        sprintf((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).compaction_cb_ctx,
                "body%02d%03d",(ulong)uVar14,uVar55 & 0xffffffff);
        *(undefined1 **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config =
             (undefined1 *)(_Var20._M_i + lVar16 + -0x1a98);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11603a;
        sVar9 = strlen((char *)psVar3);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116045;
        sVar10 = strlen((char *)__s_01);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116055;
        sVar13 = strlen((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).
                                 compaction_cb_ctx);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->staletree = (btree *)sVar13;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11607a;
        fdb_doc_create(*(fdb_doc ***)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config,psVar3,
                       sVar9,__s_01,sVar10,
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).compaction_cb_ctx,
                       (size_t)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->staletree);
        pfVar21 = *(fdb_doc **)(_Var20._M_i + uVar55 * 8 + -0x1a98);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11608c;
        fdb_set((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,pfVar21);
        uVar55 = uVar55 + 1;
        lVar16 = lVar16 + 8;
      } while (uVar55 != 100);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1160ac;
      fdb_commit((fdb_file_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops,'\x01');
      lVar16 = 0;
      do {
        pfVar21 = *(fdb_doc **)(_Var20._M_i + lVar16 * 8 + -0x19d0);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1160c0;
        fdb_del((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,pfVar21);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x19);
      pbVar53 = (btreeblk_handle *)
                ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->bhandle->blockpool).head + 3);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1160e1;
      fdb_commit((fdb_file_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops,'\x01');
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1160f0;
      fdb_get_kvs_info((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,
                       (fdb_kvs_info *)
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).wal_threshold);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->bhandle = pbVar53;
      if (*(btreeblk_handle **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).seqtree_opt !=
          pbVar53) {
        *(undefined4 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->staletree = 0;
        uVar55 = 0;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116123;
        fdb_iterator_init((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,
                          (fdb_iterator **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->btreeblkops
                          ,(void *)0x0,0,(void *)0x0,0,
                          *(fdb_iterator_opt_t *)
                           &((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->staletree);
        do {
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116135;
          fdb_iterator_get((fdb_iterator *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->btreeblkops,
                           (fdb_doc **)
                           &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).buffercache_size);
          pfVar21 = (fdb_doc *)
                    (((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).buffercache_size;
          uVar55 = (ulong)((int)uVar55 + (pfVar21->deleted ^ 1));
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116149;
          fdb_doc_free(pfVar21);
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116153;
          fVar7 = fdb_iterator_next((fdb_iterator *)
                                    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->btreeblkops);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116162;
        fdb_iterator_close((fdb_iterator *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->btreeblkops)
        ;
        pbVar53 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->bhandle;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11617a;
        printf("dbdocs(%d) expected(%d)\n",uVar55,(ulong)pbVar53 & 0xffffffff);
        if (*(btreeblk_handle **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).seqtree_opt
            != pbVar53) {
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161b9;
          iterator_set_del_docs_test();
        }
      }
      lVar16 = 0;
      do {
        pfVar21 = *(fdb_doc **)(_Var20._M_i + lVar16 * 8 + -0x1a98);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116190;
        fdb_doc_free(pfVar21);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 100);
      iVar8 = *(int *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->dhandle + 4) + 1;
    } while (iVar8 != 0x14);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161c5;
    fdb_kvs_close((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161cf;
    fdb_close((fdb_file_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161d4;
    fdb_shutdown();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161d9;
    memleak_end();
    pcVar51 = "%s PASSED\n";
    if (iterator_set_del_docs_test()::__test_pass != '\0') {
      pcVar51 = "%s FAILED\n";
    }
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11620a;
    fprintf(_stderr,pcVar51,"iterator set del docs");
    return;
  }
  pfVar15 = *(fdb_file_handle **)
             ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113444;
  fVar7 = fdb_kvs_open(pfVar15,(fdb_kvs_handle **)
                               &((fdb_kvs_handle *)(_Var20._M_i + -0x618))->max_seqnum,"prev KVS",
                       (fdb_kvs_config *)
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).num_wal_partitions);
  pcVar50 = (char *)&aStack_768;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151ab;
  pfVar15 = *(fdb_file_handle **)
             ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11346a;
  fVar7 = fdb_kvs_open(pfVar15,(fdb_kvs_handle **)
                               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key,
                       "cur KVS",
                       (fdb_kvs_config *)
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).num_wal_partitions);
  pcVar50 = (char *)&aStack_768;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151b0;
  pfVar15 = *(fdb_file_handle **)
             ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113493;
  fVar7 = fdb_kvs_open(pfVar15,(fdb_kvs_handle **)
                               &((fdb_kvs_handle *)(_Var20._M_i + -0x618))->seqnum,"next KVS",
                       (fdb_kvs_config *)
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).num_wal_partitions);
  pcVar50 = (char *)&aStack_768;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151b5;
  ((fdb_kvs_handle *)(_Var20._M_i + -0x618))->shandle = (snap_handle *)pfVar18;
  fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig = (void *)0x79656b5f76657270;
  *(undefined1 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).max_writer_lock_prob = 0;
  pfVar18 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
  *(char **)pfVar18 = (char *)0x6c61765f76657270;
  *(undefined4 *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename + 7) = 0x65756c;
  pcVar51 = (char *)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->max_seqnum;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134e9;
  sVar9 = strlen(fconfig);
  doc_03 = (char *)(sVar9 + 1);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134f5;
  sVar9 = strlen((char *)pfVar18);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11350a;
  fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar51,fconfig,(size_t)doc_03,pfVar18,sVar9 + 1);
  pcVar50 = (char *)&aStack_768;
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151ba;
  pcVar56 = (char *)0x79656b5f7478656e;
  fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig = (void *)0x79656b5f7478656e;
  *(undefined1 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).max_writer_lock_prob = 0;
  pcVar50 = (char *)0x6c61765f7478656e;
  pfVar18 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
  *(char **)pfVar18 = (char *)0x6c61765f7478656e;
  *(undefined4 *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename + 7) = 0x65756c;
  pcVar51 = (char *)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->seqnum;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113558;
  sVar9 = strlen(fconfig);
  doc_03 = (char *)(sVar9 + 1);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113564;
  sVar9 = strlen((char *)pfVar18);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113579;
  fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar51,fconfig,(size_t)doc_03,pfVar18,sVar9 + 1);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151bf;
  fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig = (void *)0x79656b5f7478656e;
  *(undefined2 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).max_writer_lock_prob = 0x32;
  pfVar18 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
  *(char **)pfVar18 = (char *)0x6c61765f7478656e;
  *(undefined4 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->txn = 0x326575;
  pcVar51 = (char *)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->seqnum;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135b5;
  sVar9 = strlen(fconfig);
  doc_03 = (char *)(sVar9 + 1);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135c1;
  sVar9 = strlen((char *)pfVar18);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135d6;
  fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar51,fconfig,(size_t)doc_03,pfVar18,sVar9 + 1);
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151c4;
  pfVar15 = *(fdb_file_handle **)
             ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135ed;
  fVar7 = fdb_commit(pfVar15,'\x01');
  if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151c9;
  if ((int)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->shandle == 0) {
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar51 = "value%08d";
    doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pcVar56 = (char *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113633;
      sprintf((char *)pfVar18,"key%06d",(ulong)pcVar56 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113643;
      sprintf(doc_03,"value%08d",(ulong)pcVar56 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113650;
      sVar9 = strlen((char *)pfVar18);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11365c;
      sVar9 = strlen(doc_03);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113671;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115125;
      *(undefined4 *)(_Var20._M_i + (long)pcVar56 * 4 + -0x4f8) = 0;
      pcVar56 = &((fdb_kvs_config *)&((filemgr *)pcVar56)->filename)->field_0x1;
    } while ((uint8_t *)pcVar56 != (uint8_t *)0x1e);
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11369a;
    fVar7 = fdb_commit(pfVar15,'\x01');
    pfVar52 = (filemgr *)pcVar56;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115248;
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_0011370a:
      pfVar18 = (fdb_kvs_handle *)
                &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
      pcVar51 = "value%08d(WAL)";
      doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
      pcVar56 = (char *)(filemgr *)0x0;
      do {
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113738;
        sprintf((char *)pfVar18,"key%06d",(ulong)pcVar56 & 0xffffffff);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113748;
        sprintf(doc_03,"value%08d(WAL)",(ulong)pcVar56 & 0xffffffff);
        pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113755;
        sVar9 = strlen((char *)pfVar18);
        fconfig = (char *)(sVar9 + 1);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113761;
        sVar9 = strlen(doc_03);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113776;
        fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011512a;
        *(undefined4 *)(_Var20._M_i + (long)pcVar56 * 4 + -0x4f8) = 1;
        pfVar52 = (filemgr *)&((fdb_kvs_config *)&((filemgr *)pcVar56)->filename)->field_0x2;
        bVar61 = pcVar56 < (filemgr *)0x1c;
        pcVar56 = (char *)pfVar52;
      } while (bVar61);
      pfVar15 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1137a0;
      fVar7 = fdb_commit(pfVar15,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) {
LAB_001137a8:
        pfVar48 = *(fdb_kvs_handle **)
                   &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        *(uint *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).max_writer_lock_prob =
             (uint)(*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                             bytes + 0x10) != 0) * 2;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1137d0;
        fVar7 = fdb_iterator_init(pfVar48,(fdb_iterator **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                           enable_background_compactor,(void *)0x0,0,(void *)0x0,0,
                                  (fdb_iterator_opt_t)
                                  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                  max_writer_lock_prob);
        pcVar56 = (char *)pfVar52;
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151ce;
        pfVar18 = (fdb_kvs_handle *)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
        pcVar50 = "value%08d";
        pcVar51 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1137fb;
          fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)pfVar18);
          if (fVar7 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            uVar14 = (int)fconfig +
                     (uint)(*(int *)(_Var20._M_i + (long)(int)fconfig * 4 + -0x4f8) == 2);
            fconfig = (char *)(ulong)uVar14;
            pcVar56 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar56 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113833;
            sprintf(pcVar51,pcVar56,(ulong)uVar14);
            doc_03 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar9 = ((btreeblk_handle *)doc_03)->ndeltanodes;
            pcVar56 = (char *)((btreeblk_handle *)doc_03)->log_callback;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11384d;
            iVar8 = bcmp(pcVar56,pcVar51,sVar9);
            if (iVar8 != 0) goto LAB_0011514f;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11385d;
            fdb_doc_free((fdb_doc *)doc_03);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            fconfig = (char *)(ulong)(uVar14 + 1);
          }
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113872;
          fVar7 = fdb_iterator_next(pfVar2);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig != 0x1e) goto LAB_001151d3;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11388e;
        fVar7 = fdb_iterator_prev(pfVar2);
        if (fVar7 == FDB_RESULT_ITERATOR_FAIL) {
LAB_001151a1:
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151a6;
          iterator_complete_test();
          goto LAB_001151a6;
        }
        fconfig = (char *)0x1e;
        pfVar18 = (fdb_kvs_handle *)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
        pcVar50 = "value%08d";
        pcVar51 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        do {
          uVar14 = (int)fconfig - 1;
          fconfig = (char *)(ulong)uVar14;
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1138bf;
          fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)pfVar18);
          if (fVar7 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            uVar14 = uVar14 - (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) == 2);
            fconfig = (char *)(ulong)uVar14;
            pcVar56 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar56 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1138f7;
            sprintf(pcVar51,pcVar56,(ulong)uVar14);
            doc_03 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar9 = ((btreeblk_handle *)doc_03)->ndeltanodes;
            pcVar56 = (char *)((btreeblk_handle *)doc_03)->log_callback;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113911;
            iVar8 = bcmp(pcVar56,pcVar51,sVar9);
            if (iVar8 != 0) goto LAB_0011515f;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113921;
            fdb_doc_free((fdb_doc *)doc_03);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
          }
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113934;
          fVar7 = fdb_iterator_prev(pfVar2);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig != 0) goto LAB_001151a1;
        pcVar51 = "key%06d";
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        fconfig = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        pcVar50 = (char *)0x0;
        do {
          if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar50 ==
              (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1e) goto LAB_00113a60;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113977;
          sprintf(doc_03,"key%06d",(ulong)pcVar50 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113984;
          sVar9 = strlen(doc_03);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113995;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_03,sVar9 + 1,'\0');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001150f3;
          iVar8 = *(int *)(_Var20._M_i + (long)pcVar50 * 4 + -0x4f8);
          *(undefined1 **)
           ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               (undefined1 *)((long)pcVar50 + 1);
          uVar55 = (ulong)pcVar50 & 0xffffffff;
          if (iVar8 == 2) {
            uVar55 = (ulong)((long)pcVar50 + 1) & 0xffffffff;
          }
          do {
            uVar14 = (uint)uVar55;
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1139bd;
            fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1139d4;
            sprintf(doc_03,"key%06d",uVar55);
            uVar14 = uVar14 + (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) == 2);
            pcVar56 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar56 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a07;
            sprintf(fconfig,pcVar56,(ulong)uVar14);
            pfVar18 = (fdb_kvs_handle *)
                      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
            pvVar59 = (pfVar18->kvs_config).custom_cmp_param;
            pcVar56 = (char *)(pfVar18->field_6).seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a1f;
            iVar8 = bcmp(pcVar56,fconfig,(size_t)pvVar59);
            if (iVar8 != 0) {
              (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                   (void *)0x115083;
              iterator_complete_test();
              goto LAB_00115083;
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a2f;
            fdb_doc_free((fdb_doc *)pfVar18);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar14 = uVar14 + 1;
            uVar55 = (ulong)uVar14;
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a44;
            fVar7 = fdb_iterator_next(pfVar2);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          pcVar50 = *(char **)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                               bytes + 0x14);
        } while (uVar14 == 0x1e);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a60;
        iterator_complete_test();
LAB_00113a60:
        pcVar51 = "key%06d";
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        fconfig = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        pcVar50 = (char *)0x0;
        do {
          if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar50 ==
              (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1e) goto LAB_00113b7b;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a92;
          sprintf(doc_03,"key%06d",(ulong)pcVar50 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a9f;
          sVar9 = strlen(doc_03);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ab0;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_03,sVar9 + 1,'\0');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001150f8;
          iVar8 = *(int *)(_Var20._M_i + (long)pcVar50 * 4 + -0x4f8);
          *(undefined1 **)
           ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               (undefined1 *)((long)pcVar50 + 1);
          uVar55 = (ulong)pcVar50 & 0xffffffff;
          if (iVar8 == 2) {
            uVar55 = (ulong)((long)pcVar50 + 1) & 0xffffffff;
          }
          do {
            uVar14 = (uint)uVar55;
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ad8;
            fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113aef;
            sprintf(doc_03,"key%06d",uVar55);
            uVar14 = uVar14 - (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) == 2);
            pcVar56 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar56 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b22;
            sprintf(fconfig,pcVar56,(ulong)uVar14);
            pfVar18 = (fdb_kvs_handle *)
                      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
            pvVar59 = (pfVar18->kvs_config).custom_cmp_param;
            pcVar56 = (char *)(pfVar18->field_6).seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b3a;
            iVar8 = bcmp(pcVar56,fconfig,(size_t)pvVar59);
            if (iVar8 != 0) goto LAB_00115083;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b4a;
            fdb_doc_free((fdb_doc *)pfVar18);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar14 = uVar14 - 1;
            uVar55 = (ulong)uVar14;
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b5f;
            fVar7 = fdb_iterator_prev(pfVar2);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          pcVar50 = *(char **)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                               bytes + 0x14);
        } while (uVar14 == 0xffffffff);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113b7b;
        iterator_complete_test();
LAB_00113b7b:
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar50 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ba0;
          sprintf(doc_03,"key%06d",(ulong)fconfig & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bad;
          sVar9 = strlen(doc_03);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bc1;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_03,sVar9 + 1,'\x01');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001150fd;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig -
                           (uint)(*(int *)(_Var20._M_i + (long)fconfig * 4 + -0x4f8) == 2));
          do {
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113be8;
            fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c04;
            sprintf(doc_03,"key%06d",pfVar18);
            uVar14 = (int)pfVar18 +
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar14;
            pcVar51 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar51 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c3a;
            sprintf(pcVar50,pcVar51,(ulong)uVar14);
            pcVar56 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pvVar59 = *(void **)&((filemgr *)pcVar56)->blocksize;
            pcVar51 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar56)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c52;
            iVar8 = bcmp(pcVar51,pcVar50,(size_t)pvVar59);
            if (iVar8 != 0) goto LAB_00115093;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c62;
            fdb_doc_free((fdb_doc *)pcVar56);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar14 + 1);
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c78;
            fVar7 = fdb_iterator_next(pfVar2);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != 0x1e) goto LAB_00115102;
          fconfig = (char *)((long)&(((snap_handle *)fconfig)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig != (snap_handle *)0x1e);
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar50 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cbd;
          sprintf(doc_03,"key%06d",(ulong)fconfig & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cca;
          sVar9 = strlen(doc_03);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cde;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_03,sVar9 + 1,'\x01');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115107;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig -
                           (uint)(*(int *)(_Var20._M_i + (long)fconfig * 4 + -0x4f8) == 2));
          do {
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d05;
            fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d21;
            sprintf(doc_03,"key%06d",pfVar18);
            uVar14 = (int)pfVar18 -
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar14;
            pcVar51 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar51 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d57;
            sprintf(pcVar50,pcVar51,(ulong)uVar14);
            pcVar56 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pvVar59 = *(void **)&((filemgr *)pcVar56)->blocksize;
            pcVar51 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar56)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d6f;
            iVar8 = bcmp(pcVar51,pcVar50,(size_t)pvVar59);
            if (iVar8 != 0) goto LAB_001150a3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d7f;
            fdb_doc_free((fdb_doc *)pcVar56);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar14 - 1);
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d95;
            fVar7 = fdb_iterator_prev(pfVar2);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != -1) goto LAB_0011510c;
          fconfig = (char *)((long)&(((snap_handle *)fconfig)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig != (snap_handle *)0x1e);
        pcVar51 = "key%06d+";
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar56 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        uVar55 = 0;
        do {
          if (uVar55 == 0x1e) goto LAB_00113ed3;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113de7;
          sprintf(doc_03,"key%06d+",uVar55 & 0xffffffff);
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113df4;
          sVar9 = strlen(doc_03);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113e05;
          fdb_iterator_seek(pfVar2,doc_03,sVar9 + 1,'\0');
          iVar8 = *(int *)(_Var20._M_i + uVar55 * 4 + -0x4f4);
          *(ulong *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes +
                    0x14) = uVar55 + 1;
          uVar58 = (ulong)((int)uVar55 + 2);
          if (iVar8 != 2) {
            uVar58 = uVar55 + 1 & 0xffffffff;
          }
          do {
            uVar14 = (uint)uVar58;
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e2a;
            fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e42;
            sprintf(doc_03,"key%06d+",uVar58);
            uVar14 = uVar14 + (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar14;
            pcVar50 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar50 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e78;
            sprintf(pcVar56,pcVar50,(ulong)uVar14);
            pcVar50 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            aVar49 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x10);
            fconfig = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              ((long)pcVar50 + 0x40))->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e90;
            iVar8 = bcmp(fconfig,pcVar56,(size_t)aVar49);
            if (iVar8 != 0) goto LAB_001150b3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ea0;
            fdb_doc_free((fdb_doc *)pcVar50);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar14 = uVar14 + 1;
            uVar58 = (ulong)uVar14;
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113eb6;
            fVar7 = fdb_iterator_next(pfVar2);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          uVar55 = *(ulong *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                              bytes + 0x14);
        } while (uVar14 == 0x1e);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ed3;
        iterator_complete_test();
LAB_00113ed3:
        fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar56 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        pcVar50 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ef8;
          sprintf(fconfig,"key%06d+",(ulong)pcVar50 & 0xffffffff);
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f05;
          sVar9 = strlen(fconfig);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f16;
          fdb_iterator_seek(pfVar2,fconfig,sVar9 + 1,'\0');
          iVar8 = *(int *)(_Var20._M_i + (long)pcVar50 * 4 + -0x4f4);
          *(undefined1 **)
           ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               (undefined1 *)((long)pcVar50 + 1);
          pfVar18 = (fdb_kvs_handle *)(ulong)((int)pcVar50 + 2);
          if (iVar8 != 2) {
            pfVar18 = (fdb_kvs_handle *)((ulong)((long)pcVar50 + 1) & 0xffffffff);
          }
          do {
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f3b;
            fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f57;
            sprintf(fconfig,"key%06d+",pfVar18);
            uVar14 = (int)pfVar18 -
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar14;
            pcVar51 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar51 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f8d;
            sprintf(pcVar56,pcVar51,(ulong)uVar14);
            doc_03 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar9 = ((btreeblk_handle *)doc_03)->ndeltanodes;
            pcVar51 = (char *)((btreeblk_handle *)doc_03)->log_callback;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fa7;
            iVar8 = bcmp(pcVar51,pcVar56,sVar9);
            if (iVar8 != 0) goto LAB_001150c3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fb7;
            fdb_doc_free((fdb_doc *)doc_03);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar14 - 1);
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fcd;
            fVar7 = fdb_iterator_prev(pfVar2);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar50 ==
              (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1d) goto LAB_00113ff0;
          pcVar50 = *(char **)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                               bytes + 0x14);
        } while ((int)pfVar18 == -1);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ff0;
        iterator_complete_test();
LAB_00113ff0:
        if ((int)pfVar18 != 0x1e) goto LAB_001151d8;
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar50 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11401f;
          sprintf(doc_03,"key%06d+",(ulong)fconfig & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11402c;
          sVar9 = strlen(doc_03);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114040;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_03,sVar9 + 1,'\x01');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115111;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig -
                           (uint)(*(int *)(_Var20._M_i + (long)fconfig * 4 + -0x4f8) == 2));
          do {
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114067;
            fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114083;
            sprintf(doc_03,"key%06d+",pfVar18);
            uVar14 = (int)pfVar18 +
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar14;
            pcVar51 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar51 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140b9;
            sprintf(pcVar50,pcVar51,(ulong)uVar14);
            pcVar56 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pvVar59 = *(void **)&((filemgr *)pcVar56)->blocksize;
            pcVar51 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar56)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140d1;
            iVar8 = bcmp(pcVar51,pcVar50,(size_t)pvVar59);
            if (iVar8 != 0) goto LAB_001150d3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140e1;
            fdb_doc_free((fdb_doc *)pcVar56);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar14 + 1);
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140f7;
            fVar7 = fdb_iterator_next(pfVar2);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != 0x1e) goto LAB_00115116;
          fconfig = (char *)((long)&(((snap_handle *)fconfig)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig != (snap_handle *)0x1e);
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar50 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11413c;
          sprintf(doc_03,"key%06d+",(ulong)fconfig & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114149;
          sVar9 = strlen(doc_03);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11415d;
          fVar7 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_03,sVar9 + 1,'\x01');
          if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011511b;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig -
                           (uint)(*(int *)(_Var20._M_i + (long)fconfig * 4 + -0x4f8) == 2));
          do {
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114184;
            fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar7 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1141a0;
            sprintf(doc_03,"key%06d+",pfVar18);
            uVar14 = (int)pfVar18 -
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar14;
            pcVar51 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
              pcVar51 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1141d6;
            sprintf(pcVar50,pcVar51,(ulong)uVar14);
            pcVar56 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pvVar59 = *(void **)&((filemgr *)pcVar56)->blocksize;
            pcVar51 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar56)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1141ee;
            iVar8 = bcmp(pcVar51,pcVar50,(size_t)pvVar59);
            if (iVar8 != 0) goto LAB_001150e3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1141fe;
            fdb_doc_free((fdb_doc *)pcVar56);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar14 - 1);
            pfVar2 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114214;
            fVar7 = fdb_iterator_prev(pfVar2);
          } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != -1) goto LAB_00115120;
          fconfig = (char *)((long)&(((snap_handle *)fconfig)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig != (snap_handle *)0x1e);
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11423e;
        fVar7 = fdb_iterator_seek_to_min(pfVar2);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151dd;
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar51 = "value%08d";
        pcVar56 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        pfVar18 = (fdb_kvs_handle *)0x0;
        do {
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11426f;
          fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                           num_bgflusher_threads);
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11428b;
          sprintf(doc_03,"key%06d+",pfVar18);
          uVar14 = (int)pfVar18 +
                   (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
          pfVar18 = (fdb_kvs_handle *)(ulong)uVar14;
          pcVar50 = "value%08d";
          if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
            pcVar50 = "value%08d(WAL)";
          }
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142bd;
          sprintf(pcVar56,pcVar50,(ulong)uVar14);
          pcVar50 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                            num_bgflusher_threads;
          aVar49 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x10);
          fconfig = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x40)
                            )->seqtree;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142d5;
          iVar8 = bcmp(fconfig,pcVar56,(size_t)aVar49);
          if (iVar8 != 0) goto LAB_0011512f;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142e5;
          fdb_doc_free((fdb_doc *)pcVar50);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
          pfVar18 = (fdb_kvs_handle *)(ulong)(uVar14 + 1);
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142fb;
          fVar7 = fdb_iterator_next(pfVar2);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pfVar18 != 0x1e) goto LAB_001151e2;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114318;
        fVar7 = fdb_iterator_seek_to_max(pfVar2);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151e7;
        fconfig = (char *)0x1d;
        doc_03 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar51 = "value%08d";
        pcVar56 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        do {
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11434b;
          fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                           num_bgflusher_threads);
          if (fVar7 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114366;
          sprintf(doc_03,"key%06d+",fconfig);
          uVar14 = (int)fconfig -
                   (uint)(*(int *)(_Var20._M_i + (long)(int)fconfig * 4 + -0x4f8) == 2);
          fconfig = (char *)(ulong)uVar14;
          pcVar50 = "value%08d";
          if (*(int *)(_Var20._M_i + (long)(int)uVar14 * 4 + -0x4f8) != 0) {
            pcVar50 = "value%08d(WAL)";
          }
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114395;
          sprintf(pcVar56,pcVar50,(ulong)uVar14);
          pcVar50 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                            num_bgflusher_threads;
          aVar49 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x10);
          pfVar18 = (fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x40))->
                    seqtree;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143ad;
          iVar8 = bcmp(pfVar18,pcVar56,(size_t)aVar49);
          if (iVar8 != 0) goto LAB_0011513f;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143bd;
          fdb_doc_free((fdb_doc *)pcVar50);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
          fconfig = (char *)(ulong)(uVar14 - 1);
          pfVar2 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143d2;
          fVar7 = fdb_iterator_prev(pfVar2);
        } while (fVar7 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig != -1) goto LAB_001151ec;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143ee;
        fVar7 = fdb_iterator_close(pfVar2);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151f1;
        fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114414;
        sprintf(fconfig,"key%06d",0x14);
        pfVar18 = *(fdb_kvs_handle **)
                   &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114421;
        sVar9 = strlen(fconfig);
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).max_writer_lock_prob =
             8;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114440;
        fVar7 = fdb_iterator_init(pfVar18,(fdb_iterator **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                           enable_background_compactor,(void *)0x0,0,fconfig,
                                  sVar9 + 1,
                                  (fdb_iterator_opt_t)
                                  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                  max_writer_lock_prob);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151f6;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114452;
        fVar7 = fdb_iterator_seek_to_max(pfVar2);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001151fb;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114469;
        fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                         num_bgflusher_threads);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115200;
        pcVar56 = "value%08d";
        fconfig = "value%08d(WAL)";
        pcVar51 = "value%08d(WAL)";
        if (*(int *)((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->log_callback).callback + 4)
            == 0) {
          pcVar51 = "value%08d";
        }
        doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144a5;
        sprintf(doc_03,pcVar51,0x13);
        pfVar18 = (fdb_kvs_handle *)
                  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
        pvVar59 = (pfVar18->kvs_config).custom_cmp_param;
        pcVar51 = (char *)(pfVar18->field_6).seqtree;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144bd;
        iVar8 = bcmp(pcVar51,doc_03,(size_t)pvVar59);
        if (iVar8 != 0) goto LAB_00115205;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144cd;
        fdb_doc_free((fdb_doc *)pfVar18);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144e0;
        fVar7 = fdb_iterator_close(pfVar2);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115215;
        pfVar18 = (fdb_kvs_handle *)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114506;
        sprintf((char *)pfVar18,"key%06d",10);
        pcVar51 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114513;
        sVar9 = strlen((char *)pfVar18);
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).max_writer_lock_prob =
             4;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114534;
        fVar7 = fdb_iterator_init((fdb_kvs_handle *)pcVar51,
                                  (fdb_iterator **)
                                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                   enable_background_compactor,pfVar18,sVar9 + 1,(void *)0x0,0,
                                  (fdb_iterator_opt_t)
                                  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                  max_writer_lock_prob);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011521a;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114546;
        fVar7 = fdb_iterator_seek_to_min(pfVar2);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011521f;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11455d;
        fVar7 = fdb_iterator_get(pfVar2,(fdb_doc **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                         num_bgflusher_threads);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115224;
        if (*(int *)((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                            breakpad_minidump_dir + 4) == 0) {
          fconfig = "value%08d";
        }
        pcVar51 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114588;
        sprintf(pcVar51,fconfig,0xb);
        fconfig = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads
        ;
        __n = (((snap_handle *)fconfig)->avl_id).right;
        pfVar18 = (fdb_kvs_handle *)((snap_handle *)fconfig)->seqnum;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145a0;
        iVar8 = bcmp(pfVar18,pcVar51,(size_t)__n);
        if (iVar8 != 0) goto LAB_00115229;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145b0;
        fdb_doc_free((fdb_doc *)fconfig);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
        pfVar2 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145c3;
        fVar7 = fdb_iterator_close(pfVar2);
        fconfig = (char *)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->shandle;
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115239;
        pfVar15 = *(fdb_file_handle **)
                   ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145dd;
        fVar7 = fdb_close(pfVar15);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011523e;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145ea;
        fVar7 = fdb_shutdown();
        if (fVar7 == FDB_RESULT_SUCCESS) {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145f7;
          memleak_end();
          (((fdb_kvs_handle *)(_Var20._M_i + -0x410))->bub_ctx).entries = (list *)0x20747365742065;
          ((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node = (kvs_opened_node *)0x726f746172657469;
          *(undefined8 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->num_iterators =
               0x74656c706d6f6320;
          if ((int)fconfig != 0) goto LAB_00114825;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11462d;
          sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
          builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x238)),"(HB+trie: all, W",0x10);
          uVar62._0_1_ = ' ';
          uVar62._1_1_ = 'a';
          uVar62._2_1_ = 'l';
          uVar62._3_1_ = 'l';
          uVar64._0_1_ = ',';
          uVar64._1_1_ = ' ';
          uVar64._2_1_ = 'W';
          uVar64._3_1_ = 'A';
          uVar66._0_1_ = 'L';
          uVar66._1_1_ = ':';
          uVar66._2_1_ = ' ';
          uVar66._3_1_ = 'e';
          uVar68._0_1_ = 'v';
          uVar68._1_1_ = 'e';
          uVar68._2_1_ = 'n';
          uVar68._3_1_ = '\0';
          goto LAB_00114643;
        }
        goto LAB_00115243;
      }
      goto LAB_0011524d;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136c7;
    sprintf(fconfig,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136d4;
    sVar9 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136e3;
    fVar7 = fdb_del_kv(pfVar18,fconfig,sVar9 + 1);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115252;
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136fa;
    fVar7 = fdb_commit(pfVar15,'\x01');
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_0011370a;
    }
    goto LAB_00115257;
  }
  switch((int)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->shandle) {
  case 1:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar51 = "value%08d";
    doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar52 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146bf;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar52 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146cf;
      sprintf(doc_03,"value%08d",(ulong)pfVar52 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146dc;
      sVar9 = strlen((char *)pfVar18);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146e8;
      sVar9 = strlen(doc_03);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146fd;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011516f;
      *(undefined4 *)(_Var20._M_i + (long)pfVar52 * 4 + -0x4f8) = 0;
      pfVar52 = (filemgr *)&((fdb_kvs_config *)&pfVar52->filename)->field_0x1;
    } while (pfVar52 != (filemgr *)0x1e);
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114726;
    fVar7 = fdb_commit(pfVar15,'\x01');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011525c;
    pcVar51 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    doc_03 = "value%08d(WAL)";
    pfVar52 = (filemgr *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar48 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11475f;
      sprintf(pcVar51,"key%06d",(ulong)pfVar48 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11476f;
      sprintf((char *)pfVar52,"value%08d(WAL)",(ulong)pfVar48 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11477c;
      sVar9 = strlen(pcVar51);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114788;
      sVar9 = strlen((char *)pfVar52);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11479d;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar51,(size_t)fconfig,pfVar52,sVar9 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011518d;
      *(undefined4 *)(_Var20._M_i + (long)pfVar48 * 4 + -0x4f8) = 1;
      pfVar18 = (fdb_kvs_handle *)&(pfVar48->kvs_config).field_0x2;
      bVar61 = pfVar48 < (fdb_kvs_handle *)0x1c;
      pfVar48 = pfVar18;
    } while (bVar61);
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        != 0) {
      fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147e0;
      sprintf(fconfig,"key%06d",0xf);
      pfVar18 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147ed;
      sVar9 = strlen(fconfig);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147fc;
      fVar7 = fdb_del_kv(pfVar18,fconfig,sVar9 + 1);
      if (fVar7 == FDB_RESULT_SUCCESS) {
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks
             = 2;
        goto LAB_0011480c;
      }
      goto LAB_0011528e;
    }
LAB_0011480c:
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114818;
    fVar7 = fdb_commit(pfVar15,'\0');
    if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114825;
    iterator_complete_test();
    break;
  case 2:
switchD_0011468f_caseD_2:
    pcVar51 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    doc_03 = "value%08d";
    pfVar52 = (filemgr *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar18 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c90;
      sprintf(pcVar51,"key%06d",(ulong)pfVar18 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ca0;
      sprintf((char *)pfVar52,"value%08d",(ulong)pfVar18 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cad;
      sVar9 = strlen(pcVar51);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cb9;
      sVar9 = strlen((char *)pfVar52);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cce;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar51,(size_t)fconfig,pfVar52,sVar9 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115183;
      *(undefined4 *)(_Var20._M_i + (long)pfVar18 * 4 + -0x4f8) = 0;
      pfVar48 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x2;
      bVar61 = pfVar18 < (fdb_kvs_handle *)0x1c;
      pfVar18 = pfVar48;
    } while (bVar61);
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cfb;
    fVar7 = fdb_commit(pfVar15,'\x01');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115270;
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114d6b:
      pfVar18 = (fdb_kvs_handle *)
                &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
      pcVar51 = "value%08d(WAL)";
      doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
      pcVar56 = (char *)(filemgr *)0x0;
      do {
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d99;
        sprintf((char *)pfVar18,"key%06d",(ulong)pcVar56 & 0xffffffff);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114da9;
        sprintf(doc_03,"value%08d(WAL)",(ulong)pcVar56 & 0xffffffff);
        pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114db6;
        sVar9 = strlen((char *)pfVar18);
        fconfig = (char *)(sVar9 + 1);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114dc2;
        sVar9 = strlen(doc_03);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114dd7;
        fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011519c;
        *(undefined4 *)(_Var20._M_i + (long)pcVar56 * 4 + -0x4f8) = 1;
        pfVar52 = (filemgr *)&((fdb_kvs_config *)&((filemgr *)pcVar56)->filename)->field_0x2;
        bVar61 = pcVar56 < (filemgr *)0x1c;
        pcVar56 = (char *)pfVar52;
      } while (bVar61);
      pfVar15 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e01;
      fVar7 = fdb_commit(pfVar15,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e0e;
      iterator_complete_test();
      goto switchD_0011468f_default;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d28;
    sprintf(fconfig,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d35;
    sVar9 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d44;
    fVar7 = fdb_del_kv(pfVar18,fconfig,sVar9 + 1);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115284;
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d5b;
    fVar7 = fdb_commit(pfVar15,'\x01');
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114d6b;
    }
    goto LAB_00115289;
  case 3:
switchD_0011468f_caseD_3:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar51 = "value%08d";
    doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar57 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149eb;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar57 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149fb;
      sprintf(doc_03,"value%08d",(ulong)pfVar57 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a08;
      sVar9 = strlen((char *)pfVar18);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a14;
      sVar9 = strlen(doc_03);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a29;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115179;
      *(undefined4 *)(_Var20._M_i + (long)pfVar57 * 4 + -0x4f8) = 0;
      pfVar52 = (filemgr *)&((fdb_kvs_config *)&pfVar57->filename)->field_0x2;
      bVar61 = pfVar57 < (filemgr *)0x1c;
      pfVar57 = pfVar52;
    } while (bVar61);
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a56;
    fVar7 = fdb_commit(pfVar15,'\x01');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115266;
    pcVar51 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    doc_03 = "value%08d(WAL)";
    pfVar52 = (filemgr *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar48 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a8f;
      sprintf(pcVar51,"key%06d",(ulong)pfVar48 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a9f;
      sprintf((char *)pfVar52,"value%08d(WAL)",(ulong)pfVar48 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114aac;
      sVar9 = strlen(pcVar51);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ab8;
      sVar9 = strlen((char *)pfVar52);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114acd;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar51,(size_t)fconfig,pfVar52,sVar9 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115192;
      *(undefined4 *)(_Var20._M_i + (long)pfVar48 * 4 + -0x4f8) = 1;
      pfVar18 = (fdb_kvs_handle *)&(pfVar48->kvs_config).field_0x2;
      bVar61 = pfVar48 < (fdb_kvs_handle *)0x1c;
      pfVar48 = pfVar18;
    } while (bVar61);
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114b3c:
      pfVar15 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b48;
      fVar7 = fdb_commit(pfVar15,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b55;
      iterator_complete_test();
      goto switchD_0011468f_caseD_4;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b10;
    sprintf(fconfig,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b1d;
    sVar9 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b2c;
    fVar7 = fdb_del_kv(pfVar18,fconfig,sVar9 + 1);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114b3c;
    }
    goto LAB_00115293;
  case 4:
switchD_0011468f_caseD_4:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar51 = "value%08d";
    doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar52 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b83;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar52 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b93;
      sprintf(doc_03,"value%08d",(ulong)pfVar52 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ba0;
      sVar9 = strlen((char *)pfVar18);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bac;
      sVar9 = strlen(doc_03);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bc1;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011517e;
      *(undefined4 *)(_Var20._M_i + (long)pfVar52 * 4 + -0x4f8) = 0;
      pfVar52 = (filemgr *)&((fdb_kvs_config *)&pfVar52->filename)->field_0x1;
    } while (pfVar52 != (filemgr *)0x1e);
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bea;
    fVar7 = fdb_commit(pfVar15,'\x01');
    pfVar48 = pfVar18;
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_0011526b;
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114c43:
      pfVar15 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c52;
      fVar7 = fdb_commit(pfVar15,'\x01');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c5f;
      iterator_complete_test();
      goto switchD_0011468f_caseD_2;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c17;
    sprintf(fconfig,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c24;
    sVar9 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c33;
    fVar7 = fdb_del_kv(pfVar18,fconfig,sVar9 + 1);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114c43;
    }
    goto LAB_0011527f;
  case 5:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar51 = "value%08d";
    doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar52 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148e7;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar52 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148f7;
      sprintf(doc_03,"value%08d",(ulong)pfVar52 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114904;
      sVar9 = strlen((char *)pfVar18);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114910;
      sVar9 = strlen(doc_03);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114925;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115174;
      *(undefined4 *)(_Var20._M_i + (long)pfVar52 * 4 + -0x4f8) = 0;
      pfVar52 = (filemgr *)&((fdb_kvs_config *)&pfVar52->filename)->field_0x1;
    } while (pfVar52 != (filemgr *)0x1e);
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11494b;
    fVar7 = fdb_commit(pfVar15,'\0');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115261;
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_001149a4:
      pfVar15 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149b0;
      fVar7 = fdb_commit(pfVar15,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149bd;
      iterator_complete_test();
      goto switchD_0011468f_caseD_3;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114978;
    sprintf(fconfig,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114985;
    sVar9 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114994;
    fVar7 = fdb_del_kv(pfVar18,fconfig,sVar9 + 1);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_001149a4;
    }
    goto LAB_0011527a;
  default:
switchD_0011468f_default:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar51 = "value%08d";
    doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar52 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e3c;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar52 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e4c;
      sprintf(doc_03,"value%08d",(ulong)pfVar52 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e59;
      sVar9 = strlen((char *)pfVar18);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e65;
      sVar9 = strlen(doc_03);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e7a;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
      pfVar48 = pfVar18;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115188;
      *(undefined4 *)(_Var20._M_i + (long)pfVar52 * 4 + -0x4f8) = 0;
      pfVar52 = (filemgr *)&((fdb_kvs_config *)&pfVar52->filename)->field_0x1;
    } while (pfVar52 != (filemgr *)0x1e);
    pfVar15 = *(fdb_file_handle **)
               ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ea3;
    fVar7 = fdb_commit(pfVar15,'\x01');
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115275;
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar51 = "value%08d(WAL)";
    doc_03 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar52 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ed9;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar52 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ee9;
      sprintf(doc_03,"value%08d(WAL)",(ulong)pfVar52 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ef6;
      sVar9 = strlen((char *)pfVar18);
      fconfig = (char *)(sVar9 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f02;
      sVar9 = strlen(doc_03);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f17;
      fVar7 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig,doc_03,sVar9 + 1);
      pcVar56 = (char *)pfVar52;
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00115197;
      *(undefined4 *)(_Var20._M_i + (long)pfVar52 * 4 + -0x4f8) = 1;
      pfVar52 = (filemgr *)&((fdb_kvs_config *)&pfVar52->filename)->field_0x1;
    } while (pfVar52 != (filemgr *)0x1e);
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114f82:
      pfVar15 = *(fdb_file_handle **)
                 ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f8e;
      fVar7 = fdb_commit(pfVar15,'\0');
      if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f9b;
      iterator_complete_test();
switchD_0011483e_caseD_5:
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fa8;
      sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
      builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x238)),"(HB+trie: empty,",0x10);
      uVar63._0_1_ = 'e';
      uVar63._1_1_ = 'm';
      uVar63._2_1_ = 'p';
      uVar63._3_1_ = 't';
      uVar65._0_1_ = 'y';
      uVar65._1_1_ = ',';
      uVar65._2_1_ = ' ';
      uVar65._3_1_ = 'W';
      uVar67._0_1_ = 'A';
      uVar67._1_1_ = 'L';
      uVar67._2_1_ = ':';
      uVar67._3_1_ = ' ';
      uVar69._0_1_ = 'a';
      uVar69._1_1_ = 'l';
      uVar69._2_1_ = 'l';
      uVar69._3_1_ = '\0';
LAB_0011500b:
      pcVar51 = (char *)(_Var20._M_i + (sVar9 - 0x22e));
      *(undefined4 *)pcVar51 = uVar63;
      *(undefined4 *)(pcVar51 + 4) = uVar65;
      *(undefined4 *)(pcVar51 + 8) = uVar67;
      *(undefined4 *)(pcVar51 + 0xc) = uVar69;
      goto switchD_0011483e_default;
    }
    fconfig = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f56;
    sprintf(fconfig,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f63;
    sVar9 = strlen(fconfig);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f72;
    fVar7 = fdb_del_kv(pfVar18,fconfig,sVar9 + 1);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114f82;
    }
    goto LAB_00115298;
  }
LAB_00114825:
  switch((int)fconfig) {
  case 1:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11484d;
    sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    *(undefined8 *)(_Var20._M_i + (sVar9 - 0x228)) = 0x64646f203a4c41;
    break;
  case 2:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115025;
    sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x238)),"(HB+trie: odd, W",0x10);
    uVar62._0_1_ = ' ';
    uVar62._1_1_ = 'o';
    uVar62._2_1_ = 'd';
    uVar62._3_1_ = 'd';
    uVar64._0_1_ = ',';
    uVar64._1_1_ = ' ';
    uVar64._2_1_ = 'W';
    uVar64._3_1_ = 'A';
    uVar66._0_1_ = 'L';
    uVar66._1_1_ = ':';
    uVar66._2_1_ = ' ';
    uVar66._3_1_ = 'e';
    uVar68._0_1_ = 'v';
    uVar68._1_1_ = 'e';
    uVar68._2_1_ = 'n';
    uVar68._3_1_ = '\0';
    goto LAB_00114643;
  case 3:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fcd;
    sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x238)),"(HB+trie: even, ",0x10);
    uVar62._0_1_ = ' ';
    uVar62._1_1_ = 'e';
    uVar62._2_1_ = 'v';
    uVar62._3_1_ = 'e';
    uVar64._0_1_ = 'n';
    uVar64._1_1_ = ',';
    uVar64._2_1_ = ' ';
    uVar64._3_1_ = 'W';
    uVar66._0_1_ = 'A';
    uVar66._1_1_ = 'L';
    uVar66._2_1_ = ':';
    uVar66._3_1_ = ' ';
    uVar68._0_1_ = 'o';
    uVar68._1_1_ = 'd';
    uVar68._2_1_ = 'd';
    uVar68._3_1_ = '\0';
LAB_00114643:
    pcVar51 = (char *)(_Var20._M_i + (sVar9 - 0x22f));
    *(undefined4 *)pcVar51 = uVar62;
    *(undefined4 *)(pcVar51 + 4) = uVar64;
    *(undefined4 *)(pcVar51 + 8) = uVar66;
    *(undefined4 *)(pcVar51 + 0xc) = uVar68;
    goto switchD_0011483e_default;
  case 4:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ff5;
    sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x238)),"(HB+trie: all, W",0x10);
    uVar63._0_1_ = 'a';
    uVar63._1_1_ = 'l';
    uVar63._2_1_ = 'l';
    uVar63._3_1_ = ',';
    uVar65._0_1_ = ' ';
    uVar65._1_1_ = 'W';
    uVar65._2_1_ = 'A';
    uVar65._3_1_ = 'L';
    uVar67._0_1_ = ':';
    uVar67._1_1_ = ' ';
    uVar67._2_1_ = 'e';
    uVar67._3_1_ = 'm';
    uVar69._0_1_ = 'p';
    uVar69._1_1_ = 't';
    uVar69._2_1_ = 'y';
    uVar69._3_1_ = '\0';
    goto LAB_0011500b;
  case 5:
    goto switchD_0011483e_caseD_5;
  case 6:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11504d;
    sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    *(undefined8 *)(_Var20._M_i + (sVar9 - 0x228)) = 0x6c6c61203a4c41;
    break;
  default:
    goto switchD_0011483e_default;
  }
  builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x238)),"(HB+trie: all, W",0x10);
switchD_0011483e_default:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114658;
  sVar9 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
  pcVar51 = (char *)(_Var20._M_i + (sVar9 - 0x238));
  if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10) ==
      0) {
    pcVar51[0] = ')';
    pcVar51[1] = '\0';
  }
  else {
    builtin_strncpy(pcVar51,", do",4);
    builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x234)),"c de",4);
    builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x230)),"leti",4);
    builtin_strncpy((char *)(_Var20._M_i + (sVar9 - 0x22c)),"on)",4);
  }
  pcVar51 = "%s PASSED\n";
  if (iterator_complete_test(int,int)::__test_pass != '\0') {
    pcVar51 = "%s FAILED\n";
  }
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148a7;
  fprintf(_stderr,pcVar51,&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
  return;
}

Assistant:

void iterator_with_concurrent_updates_test()
{
    // unit test for MB-12287
    TEST_INIT();
    memleak_start();

    int i, n=10;
    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db1, *db2, *db3;
    fdb_iterator *itr;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    char keybuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db1, db2, db3 on the same file
    fconfig = fdb_get_default_config();
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    kvs_config = fdb_get_default_kvs_config();
    fdb_open(&dbfile, "./iterator_test1", &fconfig);

    fdb_kvs_open_default(dbfile, &db1, &kvs_config);
    status = fdb_set_log_callback(db1, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_open_default(dbfile, &db2, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_open_default(dbfile, &db3, &kvs_config);
    status = fdb_set_log_callback(db3, logCallbackFunc,
                                  (void *) "iterator_concurrent_update_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert docs using db1
    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf), NULL, 0,
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(db1, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // create an iterator using db2
    fdb_iterator_init(db2, &itr, NULL, 0, NULL, 0, FDB_ITR_NONE);
    r = 0;
    do {
        status = fdb_iterator_get(itr, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->key, doc[r]->key, rdoc->keylen);
        TEST_CMP(rdoc->body, doc[r]->body, rdoc->bodylen);
        r++;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(itr) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(itr);
    TEST_CHK(r == n);

    // same for sequence number
    fdb_iterator_sequence_init(db3, &itr, 0, 0, FDB_ITR_NONE);
    r = 0;
    do {
        status = fdb_iterator_get(itr, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        r++;
        TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)r);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(itr) == FDB_RESULT_SUCCESS);
    fdb_iterator_close(itr);
    TEST_CHK(r == n);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator with concurrent updates test");
}